

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::NewFrame(void)

{
  ImVec2 *pIVar1;
  ImDrawListFlags *pIVar2;
  float *pfVar3;
  ImGuiWindow **ppIVar4;
  int *piVar5;
  ImGuiNextWindowData *pIVar6;
  ImS8 *pIVar7;
  bool *pbVar8;
  ImU16 *pIVar9;
  bool bVar10;
  bool bVar11;
  uint uVar12;
  ImGuiID IVar13;
  ImGuiContextHook *pIVar14;
  ImFontAtlas *pIVar15;
  uint *puVar16;
  ImGuiViewportP *pIVar17;
  ImGuiInputEvent *pIVar18;
  ImGuiTableTempData *pIVar19;
  ImGuiWindowStackData *pIVar20;
  ImGuiPopupData *pIVar21;
  int *piVar22;
  ImGuiGroupData *pIVar23;
  ImGuiStackLevelInfo *pIVar24;
  ImVec2 IVar25;
  ImVec2 IVar26;
  ImVec2 IVar27;
  ImVec2 IVar28;
  ImVec2 IVar29;
  ImVec2 IVar30;
  ImVec2 IVar31;
  undefined8 uVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  ImGuiContext *pIVar36;
  ImGuiContext *pIVar37;
  ImGuiContext *pIVar38;
  undefined3 uVar39;
  bool bVar40;
  bool bVar41;
  bool bVar42;
  byte bVar43;
  int iVar44;
  ImGuiContext *g_2;
  ImGuiContext *pIVar45;
  ImGuiWindow *pIVar46;
  ImGuiWindowStackData *__dest;
  ImGuiPopupData *__dest_00;
  int *piVar47;
  ImGuiGroupData *__dest_01;
  ImGuiStackLevelInfo *__dest_02;
  int i;
  uint uVar48;
  ImGuiScrollFlags scroll_flags;
  ulong uVar49;
  ImGuiWindow *window;
  char *pcVar50;
  ImGuiWindow *parent;
  long lVar51;
  ImGuiWindow *pIVar52;
  ImGuiContext *g;
  int iVar53;
  ImGuiID IVar54;
  ImGuiWindow *old_nav_window;
  ImRect *pIVar55;
  float *pfVar56;
  ImGuiNavLayer IVar57;
  ImFont *font;
  float *pfVar58;
  int i_1;
  char cVar59;
  undefined4 uVar60;
  ImGuiContext *g_4;
  long lVar61;
  ImGuiContext *g_1;
  long lVar62;
  long lVar63;
  ulong uVar64;
  uint uVar65;
  float fVar66;
  float fVar67;
  float scale;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  ImVec2 IVar73;
  ImVec2 IVar74;
  float fVar75;
  float fVar76;
  float local_98;
  undefined1 local_88 [16];
  ImRect local_70;
  undefined4 local_5c;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  local_88._8_8_ = local_88._0_8_;
  pIVar36 = GImGui;
  bVar43 = 0;
  if (GImGui == (ImGuiContext *)0x0) {
    __assert_fail("GImGui != __null && \"No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                  ,0x107e,"void ImGui::NewFrame()");
  }
  lVar61 = (long)(GImGui->Hooks).Size;
  if (0 < lVar61) {
    lVar62 = -lVar61;
    lVar63 = lVar61 << 5;
    do {
      lVar51 = (long)(pIVar36->Hooks).Size;
      if (lVar51 < lVar61) {
        pcVar50 = "T &ImVector<ImGuiContextHook>::operator[](int) [T = ImGuiContextHook]";
        goto LAB_0013de8e;
      }
      pIVar14 = (pIVar36->Hooks).Data;
      if (*(int *)(pIVar14 + lVar63 + -0x1c) == 7) {
        memmove(pIVar14 + lVar63 + -0x20,pIVar14 + lVar63,(lVar51 + lVar62) * 0x20);
        (pIVar36->Hooks).Size = (pIVar36->Hooks).Size + -1;
      }
      lVar62 = lVar62 + 1;
      bVar41 = 1 < lVar61;
      lVar61 = lVar61 + -1;
      lVar63 = lVar63 + -0x20;
    } while (bVar41);
  }
  if (0 < (pIVar36->Hooks).Size) {
    lVar61 = 0;
    lVar63 = 0;
    do {
      pIVar14 = (pIVar36->Hooks).Data;
      if (*(int *)(pIVar14 + lVar61 + 4) == 0) {
        (**(code **)(pIVar14 + lVar61 + 0x10))(pIVar36,pIVar14 + lVar61);
      }
      lVar63 = lVar63 + 1;
      lVar61 = lVar61 + 0x20;
    } while (lVar63 < (pIVar36->Hooks).Size);
  }
  pIVar45 = GImGui;
  if (GImGui->Initialized == false) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                  ,0x1f01,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((GImGui->IO).DeltaTime <= 0.0) && (GImGui->FrameCount != 0)) {
    __assert_fail("(g.IO.DeltaTime > 0.0f || g.FrameCount == 0) && \"Need a positive DeltaTime!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                  ,0x1f02,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if ((GImGui->FrameCount != 0) && (GImGui->FrameCountEnded != GImGui->FrameCount)) {
    __assert_fail("(g.FrameCount == 0 || g.FrameCountEnded == g.FrameCount) && \"Forgot to call Render() or EndFrame() at the end of the previous frame?\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                  ,0x1f03,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((GImGui->IO).DisplaySize.x < 0.0) || ((GImGui->IO).DisplaySize.y < 0.0)) {
    __assert_fail("g.IO.DisplaySize.x >= 0.0f && g.IO.DisplaySize.y >= 0.0f && \"Invalid DisplaySize value!\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                  ,0x1f04,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  pIVar15 = (GImGui->IO).Fonts;
  if (((pIVar15->Fonts).Size < 1) || ((pIVar15->TexReady & 1U) == 0)) {
    __assert_fail("g.IO.Fonts->IsBuilt() && \"Font Atlas not built! Make sure you called ImGui_ImplXXXX_NewFrame() function for renderer backend, which should call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8()\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                  ,0x1f05,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if ((GImGui->Style).CurveTessellationTol <= 0.0) {
    __assert_fail("g.Style.CurveTessellationTol > 0.0f && \"Invalid style setting!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                  ,0x1f06,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if ((GImGui->Style).CircleTessellationMaxError <= 0.0) {
    __assert_fail("g.Style.CircleTessellationMaxError > 0.0f && \"Invalid style setting!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                  ,0x1f07,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  fVar66 = (GImGui->Style).Alpha;
  if ((fVar66 < 0.0) || (1.0 < fVar66)) {
    __assert_fail("g.Style.Alpha >= 0.0f && g.Style.Alpha <= 1.0f && \"Invalid style setting!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                  ,0x1f08,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((GImGui->Style).WindowMinSize.x < 1.0) || ((GImGui->Style).WindowMinSize.y < 1.0)) {
    __assert_fail("g.Style.WindowMinSize.x >= 1.0f && g.Style.WindowMinSize.y >= 1.0f && \"Invalid style setting.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                  ,0x1f09,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (2 < (GImGui->Style).WindowMenuButtonPosition + 1U) {
    __assert_fail("g.Style.WindowMenuButtonPosition == ImGuiDir_None || g.Style.WindowMenuButtonPosition == ImGuiDir_Left || g.Style.WindowMenuButtonPosition == ImGuiDir_Right"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                  ,0x1f0a,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  lVar61 = 0;
  do {
    if (0x200 < (GImGui->IO).KeyMap[lVar61 + 0x200] + 1U) {
      __assert_fail("g.IO.KeyMap[n] >= -1 && g.IO.KeyMap[n] < ((int)(sizeof(g.IO.KeysDown) / sizeof(*(g.IO.KeysDown)))) && \"io.KeyMap[] contains an out of bound value (need to be 0..511, or -1 for unmapped key)\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                    ,0x1f0d,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
    lVar61 = lVar61 + 1;
  } while (lVar61 != 0x85);
  if (((((GImGui->IO).ConfigFlags & 1) != 0) && ((GImGui->IO).BackendUsingLegacyKeyArrays == '\x01')
      ) && ((GImGui->IO).KeyMap[0x20c] == -1)) {
    __assert_fail("g.IO.KeyMap[ImGuiKey_Space] != -1 && \"ImGuiKey_Space is not mapped, required for keyboard navigation.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                  ,0x1f11,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((GImGui->IO).ConfigWindowsResizeFromEdges == true) && (((GImGui->IO).BackendFlags & 2) == 0))
  {
    (GImGui->IO).ConfigWindowsResizeFromEdges = false;
  }
  if (pIVar45->SettingsLoaded == false) {
    if ((pIVar45->SettingsWindows).Buf.Size != 0) {
      __assert_fail("g.SettingsWindows.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                    ,0x2ce4,"void ImGui::UpdateSettings()");
    }
    pcVar50 = (pIVar45->IO).IniFilename;
    if (pcVar50 != (char *)0x0) {
      LoadIniSettingsFromDisk(pcVar50);
    }
    pIVar45->SettingsLoaded = true;
  }
  if ((0.0 < pIVar45->SettingsDirtyTimer) &&
     (fVar66 = pIVar45->SettingsDirtyTimer - (pIVar45->IO).DeltaTime,
     pIVar45->SettingsDirtyTimer = fVar66, fVar66 <= 0.0)) {
    pcVar50 = (pIVar45->IO).IniFilename;
    if (pcVar50 == (char *)0x0) {
      (pIVar45->IO).WantSaveIniSettings = true;
    }
    else {
      SaveIniSettingsToDisk(pcVar50);
    }
    pIVar45->SettingsDirtyTimer = 0.0;
  }
  pIVar36->Time = (double)(pIVar36->IO).DeltaTime + pIVar36->Time;
  pIVar36->WithinFrameScope = true;
  pIVar36->FrameCount = pIVar36->FrameCount + 1;
  pIVar36->TooltipOverrideCount = 0;
  pIVar36->WindowsActiveCount = 0;
  iVar53 = (pIVar36->MenusIdSubmittedThisFrame).Capacity;
  if (iVar53 < 0) {
    uVar48 = iVar53 / 2 + iVar53;
    uVar49 = 0;
    if (0 < (int)uVar48) {
      uVar49 = (ulong)uVar48;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar22 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar22 = *piVar22 + 1;
    }
    pIVar45 = (ImGuiContext *)(*GImAllocatorAllocFunc)(uVar49 * 4,GImAllocatorUserData);
    puVar16 = (pIVar36->MenusIdSubmittedThisFrame).Data;
    if (puVar16 != (uint *)0x0) {
      memcpy(pIVar45,puVar16,(long)(pIVar36->MenusIdSubmittedThisFrame).Size << 2);
      puVar16 = (pIVar36->MenusIdSubmittedThisFrame).Data;
      if ((puVar16 != (uint *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar22 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar22 = *piVar22 + -1;
      }
      (*GImAllocatorFreeFunc)(puVar16,GImAllocatorUserData);
    }
    (pIVar36->MenusIdSubmittedThisFrame).Data = (uint *)pIVar45;
    (pIVar36->MenusIdSubmittedThisFrame).Capacity = (int)uVar49;
  }
  (pIVar36->MenusIdSubmittedThisFrame).Size = 0;
  fVar66 = (pIVar36->IO).DeltaTime;
  iVar53 = pIVar36->FramerateSecPerFrameIdx;
  pIVar36->FramerateSecPerFrameAccum =
       (fVar66 - pIVar36->FramerateSecPerFrame[iVar53]) + pIVar36->FramerateSecPerFrameAccum;
  pIVar36->FramerateSecPerFrame[iVar53] = fVar66;
  iVar44 = iVar53 + (int)((ulong)((long)(iVar53 + 1) * -0x77777777) >> 0x20) + 1;
  pIVar36->FramerateSecPerFrameIdx = iVar53 + 1 + ((iVar44 >> 6) - (iVar44 >> 0x1f)) * -0x78;
  iVar53 = 0x77;
  if (pIVar36->FramerateSecPerFrameCount < 0x77) {
    iVar53 = pIVar36->FramerateSecPerFrameCount;
  }
  pIVar36->FramerateSecPerFrameCount = iVar53 + 1;
  uVar48 = -(uint)(0.0 < pIVar36->FramerateSecPerFrameAccum);
  (pIVar36->IO).Framerate =
       (float)(~uVar48 & 0x7f7fffff |
              (uint)(1.0 / (pIVar36->FramerateSecPerFrameAccum / (float)(iVar53 + 1))) & uVar48);
  pIVar37 = GImGui;
  if ((GImGui->Viewports).Size != 1) {
    __assert_fail("g.Viewports.Size == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                  ,0x2e14,"void ImGui::UpdateViewportsNewFrame()");
  }
  pIVar17 = *(GImGui->Viewports).Data;
  (pIVar17->super_ImGuiViewport).Flags = 5;
  (pIVar17->super_ImGuiViewport).Pos.x = 0.0;
  (pIVar17->super_ImGuiViewport).Pos.y = 0.0;
  (pIVar17->super_ImGuiViewport).Size = (pIVar37->IO).DisplaySize;
  if (0 < (pIVar37->Viewports).Size) {
    lVar61 = 0;
    do {
      pIVar17 = (pIVar37->Viewports).Data[lVar61];
      pIVar17->WorkOffsetMin = pIVar17->BuildWorkOffsetMin;
      pIVar17->WorkOffsetMax = pIVar17->BuildWorkOffsetMax;
      (pIVar17->BuildWorkOffsetMin).x = 0.0;
      (pIVar17->BuildWorkOffsetMin).y = 0.0;
      (pIVar17->BuildWorkOffsetMax).x = 0.0;
      (pIVar17->BuildWorkOffsetMax).y = 0.0;
      fVar66 = (pIVar17->WorkOffsetMin).x;
      fVar69 = (pIVar17->WorkOffsetMin).y;
      IVar73.x = (pIVar17->super_ImGuiViewport).Pos.x + fVar66;
      fVar76 = ((pIVar17->super_ImGuiViewport).Size.x - fVar66) + (pIVar17->WorkOffsetMax).x;
      IVar73.y = (pIVar17->super_ImGuiViewport).Pos.y + fVar69;
      fVar66 = ((pIVar17->super_ImGuiViewport).Size.y - fVar69) + (pIVar17->WorkOffsetMax).y;
      IVar31.y = (float)(~-(uint)(fVar66 <= 0.0) & (uint)fVar66);
      IVar31.x = (float)(~-(uint)(fVar76 <= 0.0) & (uint)fVar76);
      (pIVar17->super_ImGuiViewport).WorkPos = IVar73;
      (pIVar17->super_ImGuiViewport).WorkSize = IVar31;
      lVar61 = lVar61 + 1;
    } while (lVar61 < (pIVar37->Viewports).Size);
  }
  ((pIVar36->IO).Fonts)->Locked = true;
  font = (GImGui->IO).FontDefault;
  if (font == (ImFont *)0x0) {
    pIVar15 = (GImGui->IO).Fonts;
    if ((pIVar15->Fonts).Size < 1) {
      pcVar50 = "T &ImVector<ImFont *>::operator[](int) [T = ImFont *]";
LAB_0013de8e:
      __assert_fail("i >= 0 && i < Size",
                    "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.h"
                    ,0x702,pcVar50);
    }
    font = *(pIVar15->Fonts).Data;
  }
  SetCurrentFont(font);
  if (pIVar36->Font->ContainerAtlas == (ImFontAtlas *)0x0) {
    __assert_fail("g.Font->IsLoaded()",
                  "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                  ,0x10a2,"void ImGui::NewFrame()");
  }
  lVar61 = (long)(pIVar36->Viewports).Size;
  if (lVar61 < 1) {
    fVar69 = -3.4028235e+38;
    fVar66 = 3.4028235e+38;
    fVar76 = 3.4028235e+38;
    fVar68 = -3.4028235e+38;
  }
  else {
    fVar76 = 3.4028235e+38;
    lVar63 = 0;
    fVar69 = -3.4028235e+38;
    fVar70 = 3.4028235e+38;
    fVar67 = -3.4028235e+38;
    do {
      pIVar17 = (pIVar36->Viewports).Data[lVar63];
      fVar66 = (pIVar17->super_ImGuiViewport).Pos.x;
      fVar75 = (pIVar17->super_ImGuiViewport).Pos.y;
      fVar68 = (pIVar17->super_ImGuiViewport).Size.x + fVar66;
      if (fVar68 <= fVar69) {
        fVar68 = fVar69;
      }
      fVar69 = fVar68;
      fVar68 = (pIVar17->super_ImGuiViewport).Size.y + fVar75;
      if (fVar68 <= fVar67) {
        fVar68 = fVar67;
      }
      if (fVar70 <= fVar66) {
        fVar66 = fVar70;
      }
      if (fVar76 <= fVar75) {
        fVar75 = fVar76;
      }
      fVar76 = fVar75;
      lVar63 = lVar63 + 1;
      fVar70 = fVar66;
      fVar67 = fVar68;
    } while (lVar61 != lVar63);
  }
  (pIVar36->DrawListSharedData).ClipRectFullscreen.x = fVar66;
  (pIVar36->DrawListSharedData).ClipRectFullscreen.y = fVar76;
  (pIVar36->DrawListSharedData).ClipRectFullscreen.z = fVar69;
  (pIVar36->DrawListSharedData).ClipRectFullscreen.w = fVar68;
  fVar66 = (pIVar36->Style).CircleTessellationMaxError;
  (pIVar36->DrawListSharedData).CurveTessellationTol = (pIVar36->Style).CurveTessellationTol;
  ImDrawListSharedData::SetCircleTessellationMaxError(&pIVar36->DrawListSharedData,fVar66);
  uVar48 = (uint)(pIVar36->Style).AntiAliasedLines;
  (pIVar36->DrawListSharedData).InitialFlags = uVar48;
  if (((pIVar36->Style).AntiAliasedLinesUseTex != false) &&
     ((pIVar36->Font->ContainerAtlas->Flags & 4) == 0)) {
    (pIVar36->DrawListSharedData).InitialFlags = uVar48 | 2;
  }
  if ((pIVar36->Style).AntiAliasedFill == true) {
    pIVar2 = &(pIVar36->DrawListSharedData).InitialFlags;
    *(byte *)pIVar2 = (byte)*pIVar2 | 4;
  }
  if (((pIVar36->IO).BackendFlags & 8) != 0) {
    pIVar2 = &(pIVar36->DrawListSharedData).InitialFlags;
    *(byte *)pIVar2 = (byte)*pIVar2 | 8;
  }
  if (0 < (pIVar36->Viewports).Size) {
    lVar61 = 0;
    do {
      pIVar17 = (pIVar36->Viewports).Data[lVar61];
      (pIVar17->DrawDataP).DisplaySize.x = 0.0;
      (pIVar17->DrawDataP).DisplaySize.y = 0.0;
      (pIVar17->DrawDataP).FramebufferScale.x = 0.0;
      (pIVar17->DrawDataP).FramebufferScale.y = 0.0;
      (pIVar17->DrawDataP).CmdLists = (ImDrawList **)0x0;
      (pIVar17->DrawDataP).DisplayPos.x = 0.0;
      (pIVar17->DrawDataP).DisplayPos.y = 0.0;
      (pIVar17->DrawDataP).Valid = false;
      *(undefined3 *)&(pIVar17->DrawDataP).field_0x1 = 0;
      (pIVar17->DrawDataP).CmdListsCount = 0;
      (pIVar17->DrawDataP).TotalIdxCount = 0;
      (pIVar17->DrawDataP).TotalVtxCount = 0;
      lVar61 = lVar61 + 1;
    } while (lVar61 < (pIVar36->Viewports).Size);
  }
  pIVar37 = GImGui;
  if ((pIVar36->DragDropActive != false) &&
     (IVar54 = (pIVar36->DragDropPayload).SourceId, IVar54 == pIVar36->ActiveId)) {
    if (GImGui->ActiveId == IVar54) {
      GImGui->ActiveIdIsAlive = IVar54;
    }
    if (pIVar37->ActiveIdPreviousFrame == IVar54) {
      pIVar37->ActiveIdPreviousFrameIsAlive = true;
    }
  }
  if (pIVar36->HoveredIdPreviousFrame == 0) {
    pIVar36->HoveredIdTimer = 0.0;
LAB_0013ad6b:
    pIVar36->HoveredIdNotActiveTimer = 0.0;
  }
  else if ((pIVar36->HoveredId != 0) && (pIVar36->ActiveId == pIVar36->HoveredId))
  goto LAB_0013ad6b;
  IVar54 = pIVar36->HoveredId;
  if ((IVar54 != 0) &&
     (pIVar36->HoveredIdTimer = (pIVar36->IO).DeltaTime + pIVar36->HoveredIdTimer,
     pIVar36->ActiveId != IVar54)) {
    pIVar36->HoveredIdNotActiveTimer = (pIVar36->IO).DeltaTime + pIVar36->HoveredIdNotActiveTimer;
  }
  pIVar36->HoveredIdPreviousFrame = IVar54;
  pIVar36->HoveredIdPreviousFrameUsingMouseWheel = pIVar36->HoveredIdUsingMouseWheel;
  pIVar36->HoveredId = 0;
  pIVar36->HoveredIdAllowOverlap = false;
  pIVar36->HoveredIdUsingMouseWheel = false;
  pIVar36->HoveredIdDisabled = false;
  IVar54 = pIVar36->ActiveId;
  if (((pIVar36->ActiveIdIsAlive != IVar54) && (IVar54 != 0)) &&
     (pIVar36->ActiveIdPreviousFrame == IVar54)) {
    ClearActiveID();
  }
  IVar54 = pIVar36->ActiveId;
  if (IVar54 != 0) {
    pIVar36->ActiveIdTimer = (pIVar36->IO).DeltaTime + pIVar36->ActiveIdTimer;
  }
  pIVar36->LastActiveIdTimer = (pIVar36->IO).DeltaTime + pIVar36->LastActiveIdTimer;
  pIVar36->ActiveIdPreviousFrame = IVar54;
  pIVar36->ActiveIdPreviousFrameWindow = pIVar36->ActiveIdWindow;
  pIVar36->ActiveIdPreviousFrameHasBeenEditedBefore = pIVar36->ActiveIdHasBeenEditedBefore;
  pIVar36->ActiveIdIsAlive = 0;
  pIVar36->ActiveIdHasBeenEditedThisFrame = false;
  pIVar36->ActiveIdPreviousFrameIsAlive = false;
  pIVar36->ActiveIdIsJustActivated = false;
  if (IVar54 != pIVar36->TempInputId && pIVar36->TempInputId != 0) {
    pIVar36->TempInputId = 0;
  }
  if (IVar54 == 0) {
    (pIVar36->ActiveIdUsingKeyInputMask).Storage[1] = 0;
    (pIVar36->ActiveIdUsingKeyInputMask).Storage[2] = 0;
    (pIVar36->ActiveIdUsingKeyInputMask).Storage[3] = 0;
    (pIVar36->ActiveIdUsingKeyInputMask).Storage[4] = 0;
    pIVar36->ActiveIdUsingNavDirMask = 0;
    pIVar36->ActiveIdUsingNavInputMask = 0;
    (pIVar36->ActiveIdUsingKeyInputMask).Storage[0] = 0;
    (pIVar36->ActiveIdUsingKeyInputMask).Storage[1] = 0;
  }
  pIVar36->DragDropAcceptIdPrev = pIVar36->DragDropAcceptIdCurr;
  pIVar36->DragDropAcceptIdCurrRectSurface = 3.4028235e+38;
  pIVar36->DragDropAcceptIdCurr = 0;
  pIVar36->DragDropWithinSource = false;
  pIVar36->DragDropWithinTarget = false;
  pIVar36->DragDropHoldJustPressedId = 0;
  iVar53 = (pIVar36->InputEventsTrail).Capacity;
  if (iVar53 < 0) {
    uVar48 = iVar53 / 2 + iVar53;
    uVar49 = 0;
    if (0 < (int)uVar48) {
      uVar49 = (ulong)uVar48;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar22 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar22 = *piVar22 + 1;
    }
    pIVar45 = (ImGuiContext *)(*GImAllocatorAllocFunc)(uVar49 * 0x18,GImAllocatorUserData);
    pIVar18 = (pIVar36->InputEventsTrail).Data;
    if (pIVar18 != (ImGuiInputEvent *)0x0) {
      memcpy(pIVar45,pIVar18,(long)(pIVar36->InputEventsTrail).Size * 0x18);
      pIVar18 = (pIVar36->InputEventsTrail).Data;
      if ((pIVar18 != (ImGuiInputEvent *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar22 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar22 = *piVar22 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar18,GImAllocatorUserData);
    }
    (pIVar36->InputEventsTrail).Data = (ImGuiInputEvent *)pIVar45;
    (pIVar36->InputEventsTrail).Capacity = (int)uVar49;
  }
  (pIVar36->InputEventsTrail).Size = 0;
  UpdateInputEvents((pIVar36->IO).ConfigInputTrickleEventQueue);
  pIVar37 = GImGui;
  bVar41 = (GImGui->IO).KeyCtrl;
  bVar40 = (GImGui->IO).KeyShift;
  bVar42 = (GImGui->IO).KeyAlt;
  uVar48 = bVar41 + 2;
  if (bVar40 == false) {
    uVar48 = (uint)bVar41;
  }
  uVar12 = uVar48 + 4;
  if (bVar42 == false) {
    uVar12 = uVar48;
  }
  bVar10 = (GImGui->IO).KeySuper;
  uVar48 = uVar12 + 8;
  if (bVar10 == false) {
    uVar48 = uVar12;
  }
  (GImGui->IO).KeyMods = uVar48;
  if ((pIVar37->IO).BackendUsingLegacyKeyArrays == '\0') {
    lVar61 = 0;
    do {
      if ((pIVar37->IO).KeysDown[lVar61] != false) {
        __assert_fail("io.KeysDown[n] == false && \"Backend needs to either only use io.AddKeyEvent(), either only fill legacy io.KeysDown[] + io.KeyMap[]. Not both!\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                      ,0xf54,"void ImGui::UpdateKeyboardInputs()");
      }
      lVar61 = lVar61 + 1;
    } while (lVar61 != 0x200);
  }
  else {
    if (pIVar37->FrameCount == 0) {
      lVar61 = 0;
      do {
        if ((pIVar37->IO).KeyMap[lVar61] != -1) {
          __assert_fail("g.IO.KeyMap[n] == -1 && \"Backend is not allowed to write to io.KeyMap[0..511]!\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                        ,0xf5a,"void ImGui::UpdateKeyboardInputs()");
        }
        lVar61 = lVar61 + 1;
      } while (lVar61 != 0x200);
    }
    lVar61 = 0;
    do {
      uVar48 = (pIVar37->IO).KeyMap[lVar61 + 0x200];
      if ((ulong)uVar48 != 0xffffffff) {
        if (0x1ff < uVar48) {
          __assert_fail("IsLegacyKey((ImGuiKey)io.KeyMap[n])",
                        "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                        ,0xf60,"void ImGui::UpdateKeyboardInputs()");
        }
        (pIVar37->IO).KeyMap[uVar48] = (int)lVar61 + 0x200;
      }
      lVar61 = lVar61 + 1;
    } while (lVar61 != 0x85);
    lVar61 = 0;
    do {
      bVar11 = (pIVar37->IO).KeysDown[lVar61];
      if ((bVar11 != false) || ((pIVar37->IO).BackendUsingLegacyKeyArrays == '\x01')) {
        iVar53 = (pIVar37->IO).KeyMap[lVar61];
        iVar44 = (int)lVar61;
        if (iVar53 != -1) {
          iVar44 = iVar53;
        }
        if (0x84 < iVar44 - 0x200U && iVar53 != -1) {
          __assert_fail("io.KeyMap[n] == -1 || IsNamedKey(key)",
                        "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                        ,0xf69,"void ImGui::UpdateKeyboardInputs()");
        }
        (pIVar37->IO).KeysData[iVar44].Down = bVar11;
        (pIVar37->IO).BackendUsingLegacyKeyArrays = '\x01';
      }
      lVar61 = lVar61 + 1;
    } while (lVar61 != 0x200);
    if ((pIVar37->IO).BackendUsingLegacyKeyArrays == '\x01') {
      (pIVar37->IO).KeysData[0x281].Down = bVar41;
      (pIVar37->IO).KeysData[0x282].Down = bVar40;
      (pIVar37->IO).KeysData[0x283].Down = bVar42;
      (pIVar37->IO).KeysData[0x284].Down = bVar10;
    }
  }
  uVar48 = (pIVar37->IO).BackendFlags;
  if ((uVar48 & 1) == 0) {
    lVar61 = 0;
    do {
      (&(pIVar37->IO).KeysData[0x269].Down)[lVar61] = false;
      *(undefined4 *)((long)&(pIVar37->IO).KeysData[0x269].AnalogValue + lVar61) = 0;
      lVar61 = lVar61 + 0x10;
    } while (lVar61 != 0x180);
  }
  lVar61 = 0xd88;
  do {
    fVar66 = *(float *)((long)pIVar37 + lVar61 + -4);
    *(float *)(&pIVar37->Initialized + lVar61) = fVar66;
    fVar69 = -1.0;
    if ((*(char *)((long)pIVar37 + lVar61 + -8) == '\x01') && (fVar69 = 0.0, 0.0 <= fVar66)) {
      fVar69 = fVar66 + (pIVar37->IO).DeltaTime;
    }
    *(float *)((long)pIVar37 + lVar61 + -4) = fVar69;
    lVar61 = lVar61 + 0x10;
  } while (lVar61 != 0x35d8);
  (pIVar37->IO).WantSetMousePos = false;
  uVar12 = (pIVar37->IO).ConfigFlags;
  uVar48 = uVar48 & (uVar12 & 2) >> 1;
  if ((uVar48 == 1) && ((pIVar37->IO).BackendUsingLegacyNavInputArray == false)) {
    lVar61 = 0;
    do {
      fVar66 = (pIVar37->IO).NavInputs[lVar61];
      if ((fVar66 != 0.0) || (NAN(fVar66))) {
        __assert_fail("io.NavInputs[n] == 0.0f && \"Backend needs to either only use io.AddKeyEvent()/io.AddKeyAnalogEvent(), either only fill legacy io.NavInputs[]. Not both!\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                      ,0x273c,"void ImGui::NavUpdate()");
      }
      lVar61 = lVar61 + 1;
    } while (lVar61 != 0x14);
    fVar66 = (pIVar37->IO).KeysData[0x26c].AnalogValue;
    (pIVar37->IO).NavInputs[0] = fVar66;
    if (0.0 < fVar66) {
      pIVar37->NavInputSource = ImGuiInputSource_Gamepad;
    }
    fVar66 = (pIVar37->IO).KeysData[0x26e].AnalogValue;
    (pIVar37->IO).NavInputs[1] = fVar66;
    if (0.0 < fVar66) {
      pIVar37->NavInputSource = ImGuiInputSource_Gamepad;
    }
    fVar66 = (pIVar37->IO).KeysData[0x26d].AnalogValue;
    (pIVar37->IO).NavInputs[3] = fVar66;
    if (0.0 < fVar66) {
      pIVar37->NavInputSource = ImGuiInputSource_Gamepad;
    }
    fVar66 = (pIVar37->IO).KeysData[0x26b].AnalogValue;
    (pIVar37->IO).NavInputs[2] = fVar66;
    if (0.0 < fVar66) {
      pIVar37->NavInputSource = ImGuiInputSource_Gamepad;
    }
    fVar66 = (pIVar37->IO).KeysData[0x271].AnalogValue;
    (pIVar37->IO).NavInputs[4] = fVar66;
    if (0.0 < fVar66) {
      pIVar37->NavInputSource = ImGuiInputSource_Gamepad;
    }
    fVar66 = (pIVar37->IO).KeysData[0x272].AnalogValue;
    (pIVar37->IO).NavInputs[5] = fVar66;
    if (0.0 < fVar66) {
      pIVar37->NavInputSource = ImGuiInputSource_Gamepad;
    }
    fVar66 = (pIVar37->IO).KeysData[0x26f].AnalogValue;
    (pIVar37->IO).NavInputs[6] = fVar66;
    if (0.0 < fVar66) {
      pIVar37->NavInputSource = ImGuiInputSource_Gamepad;
    }
    fVar66 = (pIVar37->IO).KeysData[0x270].AnalogValue;
    (pIVar37->IO).NavInputs[7] = fVar66;
    if (0.0 < fVar66) {
      pIVar37->NavInputSource = ImGuiInputSource_Gamepad;
    }
    fVar66 = (pIVar37->IO).KeysData[0x273].AnalogValue;
    fVar69 = (pIVar37->IO).KeysData[0x274].AnalogValue;
    (pIVar37->IO).NavInputs[0xc] = fVar66;
    (pIVar37->IO).NavInputs[0xd] = fVar69;
    (pIVar37->IO).NavInputs[0xe] = fVar66;
    (pIVar37->IO).NavInputs[0xf] = fVar69;
    (pIVar37->IO).NavInputs[8] = (pIVar37->IO).KeysData[0x27b].AnalogValue;
    (pIVar37->IO).NavInputs[9] = (pIVar37->IO).KeysData[0x27c].AnalogValue;
    (pIVar37->IO).NavInputs[10] = (pIVar37->IO).KeysData[0x279].AnalogValue;
    (pIVar37->IO).NavInputs[0xb] = (pIVar37->IO).KeysData[0x27a].AnalogValue;
  }
  if ((uVar12 & 1) != 0) {
    if ((pIVar37->IO).KeysData[0x20c].Down == true) {
      (pIVar37->IO).NavInputs[0] = 1.0;
      pIVar37->NavInputSource = ImGuiInputSource_Keyboard;
    }
    if ((pIVar37->IO).KeysData[0x20d].Down == true) {
      (pIVar37->IO).NavInputs[2] = 1.0;
      pIVar37->NavInputSource = ImGuiInputSource_Keyboard;
    }
    if ((pIVar37->IO).KeysData[0x20e].Down == true) {
      (pIVar37->IO).NavInputs[1] = 1.0;
      pIVar37->NavInputSource = ImGuiInputSource_Keyboard;
    }
    if ((pIVar37->IO).KeysData[0x201].Down == true) {
      (pIVar37->IO).NavInputs[0x10] = 1.0;
      pIVar37->NavInputSource = ImGuiInputSource_Keyboard;
    }
    if ((pIVar37->IO).KeysData[0x202].Down == true) {
      (pIVar37->IO).NavInputs[0x11] = 1.0;
      pIVar37->NavInputSource = ImGuiInputSource_Keyboard;
    }
    if ((pIVar37->IO).KeysData[0x203].Down == true) {
      (pIVar37->IO).NavInputs[0x12] = 1.0;
      pIVar37->NavInputSource = ImGuiInputSource_Keyboard;
    }
    if ((pIVar37->IO).KeysData[0x204].Down == true) {
      (pIVar37->IO).NavInputs[0x13] = 1.0;
      pIVar37->NavInputSource = ImGuiInputSource_Keyboard;
    }
    if (bVar41 != false) {
      (pIVar37->IO).NavInputs[0xe] = 1.0;
    }
    if (bVar40 != false) {
      (pIVar37->IO).NavInputs[0xf] = 1.0;
    }
  }
  pfVar3 = (pIVar37->IO).NavInputsDownDuration;
  pfVar56 = pfVar3;
  pfVar58 = (pIVar37->IO).NavInputsDownDurationPrev;
  for (lVar61 = 0x14; lVar61 != 0; lVar61 = lVar61 + -1) {
    *pfVar58 = *pfVar56;
    pfVar56 = pfVar56 + (ulong)bVar43 * -2 + 1;
    pfVar58 = pfVar58 + (ulong)bVar43 * -2 + 1;
  }
  lVar61 = 0;
  do {
    fVar66 = -1.0;
    if (0.0 < (pIVar37->IO).NavInputs[lVar61]) {
      fVar66 = 0.0;
      if (0.0 <= pfVar3[lVar61]) {
        fVar66 = pfVar3[lVar61] + (pIVar37->IO).DeltaTime;
      }
    }
    pfVar3[lVar61] = fVar66;
    lVar61 = lVar61 + 1;
  } while (lVar61 != 0x14);
  if (pIVar37->NavInitResultId != 0) {
    NavInitRequestApplyResult();
  }
  pIVar37->NavInitRequest = false;
  pIVar37->NavInitRequestFromMove = false;
  pIVar37->NavInitResultId = 0;
  pIVar37->NavJustMovedToId = 0;
  if (pIVar37->NavMoveSubmitted == true) {
    NavMoveRequestApplyResult();
  }
  pIVar37->NavTabbingCounter = 0;
  pIVar37->NavMoveSubmitted = false;
  pIVar37->NavMoveScoringItems = false;
  if ((((pIVar37->NavMousePosDirty == true) && (pIVar37->NavIdIsAlive == true)) &&
      (pIVar37->NavDisableHighlight == false)) && (pIVar37->NavDisableMouseHover == true)) {
    uVar60 = (undefined4)
             CONCAT71((int7)((ulong)pIVar45 >> 8),pIVar37->NavWindow != (ImGuiWindow *)0x0);
  }
  else {
    uVar60 = 0;
  }
  pIVar37->NavMousePosDirty = false;
  IVar57 = pIVar37->NavLayer;
  if (ImGuiNavLayer_Menu < IVar57) {
    __assert_fail("g.NavLayer == ImGuiNavLayer_Main || g.NavLayer == ImGuiNavLayer_Menu",
                  "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                  ,0x277b,"void ImGui::NavUpdate()");
  }
  pIVar46 = pIVar37->NavWindow;
  pIVar52 = pIVar46;
  if (pIVar46 != (ImGuiWindow *)0x0) {
    do {
      if ((pIVar52->RootWindow == pIVar52) || ((pIVar52->Flags & 0x14000000) != 0)) {
        if (pIVar52 != pIVar46) {
          pIVar52->NavLastChildNavWindow = pIVar46;
        }
        break;
      }
      ppIVar4 = &pIVar52->ParentWindow;
      pIVar52 = *ppIVar4;
    } while (*ppIVar4 != (ImGuiWindow *)0x0);
    if (((pIVar46 != (ImGuiWindow *)0x0) && (IVar57 == ImGuiNavLayer_Main)) &&
       (pIVar46->NavLastChildNavWindow != (ImGuiWindow *)0x0)) {
      pIVar46->NavLastChildNavWindow = (ImGuiWindow *)0x0;
    }
  }
  pIVar45 = GImGui;
  pIVar46 = GetTopMostPopupModal();
  if (pIVar46 != (ImGuiWindow *)0x0) {
    pIVar45->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if ((pIVar45->NavWindowingTargetAnim != (ImGuiWindow *)0x0) &&
     (pIVar45->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    fVar66 = (pIVar45->IO).DeltaTime * -10.0 + pIVar45->NavWindowingHighlightAlpha;
    fVar66 = (float)(-(uint)(0.0 <= fVar66) & (uint)fVar66);
    pIVar45->NavWindowingHighlightAlpha = fVar66;
    if ((pIVar45->DimBgRatio <= 0.0) && (fVar66 <= 0.0)) {
      pIVar45->NavWindowingTargetAnim = (ImGuiWindow *)0x0;
    }
  }
  if ((pIVar46 == (ImGuiWindow *)0x0) && (pIVar45->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    bVar41 = (bool)(-((pIVar45->IO).NavInputsDownDuration[3] == 0.0) & 1);
  }
  else {
    bVar41 = false;
  }
  local_5c = uVar60;
  if (((pIVar46 == (ImGuiWindow *)0x0) && (pIVar45->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
     ((pIVar45->IO).KeyCtrl == true)) {
    bVar40 = IsKeyPressed(0x200,true);
  }
  else {
    bVar40 = false;
  }
  if ((bVar41 | bVar40) == 1) {
    pIVar46 = pIVar45->NavWindow;
    if (pIVar46 == (ImGuiWindow *)0x0) {
      pIVar46 = FindWindowNavFocusable((pIVar45->WindowsFocusOrder).Size + -1,-0x7fffffff,-1);
    }
    if (pIVar46 != (ImGuiWindow *)0x0) {
      pIVar46 = pIVar46->RootWindow;
      pIVar45->NavWindowingTargetAnim = pIVar46;
      pIVar45->NavWindowingTarget = pIVar46;
      pIVar45->NavWindowingTimer = 0.0;
      pIVar45->NavWindowingHighlightAlpha = 0.0;
      pIVar45->NavWindowingToggleLayer = bVar41;
      pIVar45->NavInputSource = bVar40 ^ ImGuiInputSource_Gamepad;
    }
  }
  fVar66 = (pIVar45->IO).DeltaTime + pIVar45->NavWindowingTimer;
  pIVar45->NavWindowingTimer = fVar66;
  if ((pIVar45->NavWindowingTarget == (ImGuiWindow *)0x0) ||
     (pIVar45->NavInputSource != ImGuiInputSource_Gamepad)) {
LAB_0013b7dd:
    auVar35._8_8_ = 0;
    auVar35._0_8_ = local_88._0_8_;
    local_88 = auVar35 << 0x40;
    pIVar46 = (ImGuiWindow *)0x0;
  }
  else {
    fVar69 = (fVar66 + -0.2) / 0.05;
    fVar66 = 1.0;
    if (fVar69 <= 1.0) {
      fVar66 = fVar69;
    }
    fVar66 = (float)(~-(uint)(fVar69 < 0.0) & (uint)fVar66);
    uVar65 = -(uint)(fVar66 <= pIVar45->NavWindowingHighlightAlpha);
    pIVar45->NavWindowingHighlightAlpha =
         (float)(uVar65 & (uint)pIVar45->NavWindowingHighlightAlpha | ~uVar65 & (uint)fVar66);
    fVar66 = GetNavInputAmount(0xc,ImGuiInputReadMode_RepeatSlow);
    fVar69 = GetNavInputAmount(0xd,ImGuiInputReadMode_RepeatSlow);
    iVar53 = (uint)(0.0 < fVar66) - (uint)(0.0 < fVar69);
    if (iVar53 != 0) {
      NavUpdateWindowingHighlightWindow(iVar53);
      pIVar45->NavWindowingHighlightAlpha = 1.0;
    }
    if (0.0 < (GImGui->IO).NavInputs[3]) goto LAB_0013b7dd;
    uVar49 = (ulong)GImGui >> 8;
    pbVar8 = &pIVar45->NavWindowingToggleLayer;
    *pbVar8 = (bool)(*pbVar8 &
                    (pIVar45->NavWindowingHighlightAlpha <= 1.0 &&
                    pIVar45->NavWindowingHighlightAlpha != 1.0));
    if (*pbVar8 == false) {
      pIVar46 = pIVar45->NavWindowingTarget;
      auVar33._8_8_ = 0;
      auVar33._0_8_ = local_88._0_8_;
      local_88 = auVar33 << 0x40;
    }
    else {
      local_88._1_7_ = (int7)uVar49;
      local_88[0] = pIVar45->NavWindow != (ImGuiWindow *)0x0;
      pIVar46 = (ImGuiWindow *)0x0;
    }
    pIVar45->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if ((pIVar45->NavWindowingTarget != (ImGuiWindow *)0x0) &&
     (pIVar45->NavInputSource == ImGuiInputSource_Keyboard)) {
    fVar69 = (pIVar45->NavWindowingTimer + -0.2) / 0.05;
    fVar66 = 1.0;
    if (fVar69 <= 1.0) {
      fVar66 = fVar69;
    }
    fVar66 = (float)(~-(uint)(fVar69 < 0.0) & (uint)fVar66);
    uVar65 = -(uint)(fVar66 <= pIVar45->NavWindowingHighlightAlpha);
    pIVar45->NavWindowingHighlightAlpha =
         (float)(uVar65 & (uint)pIVar45->NavWindowingHighlightAlpha | ~uVar65 & (uint)fVar66);
    bVar41 = IsKeyPressed(0x200,true);
    if (bVar41) {
      NavUpdateWindowingHighlightWindow((pIVar45->IO).KeyShift - 1 | 1);
    }
    if ((pIVar45->IO).KeyCtrl == false) {
      pIVar46 = pIVar45->NavWindowingTarget;
    }
  }
  if (((((pIVar45->IO).ConfigFlags & 1) != 0) && ((pIVar45->IO).KeyMods == 4)) &&
     (((pIVar45->IO).KeyModsPrev & 4) == 0)) {
    pIVar45->NavWindowingToggleLayer = true;
    pIVar45->NavInputSource = ImGuiInputSource_Keyboard;
  }
  if ((pIVar45->NavWindowingToggleLayer == true) &&
     (pIVar45->NavInputSource == ImGuiInputSource_Keyboard)) {
    if (((0 < (pIVar45->IO).InputQueueCharacters.Size) ||
        (((pIVar45->IO).KeyCtrl != false || ((pIVar45->IO).KeyShift != false)))) ||
       ((pIVar45->IO).KeySuper == true)) {
      pIVar45->NavWindowingToggleLayer = false;
    }
    if ((((((pIVar45->IO).KeyMods & 4) == 0) && (((pIVar45->IO).KeyModsPrev & 4) != 0)) &&
        (pIVar45->NavWindowingToggleLayer == true)) &&
       ((pIVar45->ActiveId == 0 || (pIVar45->ActiveIdAllowOverlap == true)))) {
      bVar41 = IsMousePosValid(&(pIVar45->IO).MousePos);
      bVar40 = IsMousePosValid(&(pIVar45->IO).MousePosPrev);
      uVar49 = 1;
      if (bVar40 != bVar41) {
        uVar49 = (ulong)local_88[0];
      }
      local_88._0_8_ = uVar49;
    }
    if ((pIVar45->IO).KeyAlt == false) {
      pIVar45->NavWindowingToggleLayer = false;
    }
  }
  pIVar52 = pIVar45->NavWindowingTarget;
  if ((pIVar52 != (ImGuiWindow *)0x0) && ((pIVar52->Flags & 4) == 0)) {
    fVar66 = 0.0;
    fVar69 = 0.0;
    if ((pIVar45->NavInputSource == ImGuiInputSource_Keyboard) && ((pIVar45->IO).KeyShift == false))
    {
      fVar66 = (float)(int)(GImGui->IO).KeysData[0x202].Down -
               (float)(int)(GImGui->IO).KeysData[0x201].Down;
      fVar69 = (float)(int)(GImGui->IO).KeysData[0x204].Down -
               (float)(int)(GImGui->IO).KeysData[0x203].Down;
    }
    if (pIVar45->NavInputSource == ImGuiInputSource_Gamepad) {
      IVar31 = GetNavInputAmount2d(8,ImGuiInputReadMode_Down,0.0,0.0);
      fVar66 = IVar31.x;
      fVar69 = IVar31.y;
    }
    if (((fVar66 != 0.0) || (fVar69 != 0.0)) || (NAN(fVar69))) {
      fVar76 = (pIVar45->IO).DisplayFramebufferScale.x;
      fVar68 = (pIVar45->IO).DisplayFramebufferScale.y;
      if (fVar68 <= fVar76) {
        fVar76 = fVar68;
      }
      fVar76 = (float)(int)(fVar76 * (pIVar45->IO).DeltaTime * 800.0);
      pIVar52 = pIVar52->RootWindow;
      local_70.Min.y = fVar69 * fVar76 + (pIVar52->Pos).y;
      local_70.Min.x = fVar66 * fVar76 + (pIVar52->Pos).x;
      SetWindowPos(pIVar52,&local_70.Min,1);
      if (((pIVar52->Flags & 0x100) == 0) && (GImGui->SettingsDirtyTimer <= 0.0)) {
        GImGui->SettingsDirtyTimer = (GImGui->IO).IniSavingRate;
      }
      pIVar45->NavDisableMouseHover = true;
    }
  }
  if (pIVar46 != (ImGuiWindow *)0x0) {
    if ((pIVar45->NavWindow == (ImGuiWindow *)0x0) || (pIVar46 != pIVar45->NavWindow->RootWindow)) {
      ClearActiveID();
      pIVar38 = GImGui;
      pIVar38->NavMousePosDirty = true;
      pIVar38->NavDisableHighlight = false;
      pIVar38->NavDisableMouseHover = true;
      pIVar52 = pIVar46->NavLastChildNavWindow;
      if ((pIVar52 == (ImGuiWindow *)0x0) || (pIVar52->WasActive == false)) {
        pIVar52 = pIVar46;
      }
      ClosePopupsOverWindow(pIVar52,false);
      FocusWindow(pIVar52);
      if (pIVar52->NavLastIds[0] == 0) {
        NavInitWindow(pIVar52,false);
      }
      if ((pIVar52->DC).NavLayersActiveMaskNext == 2) {
        pIVar45->NavLayer = ImGuiNavLayer_Menu;
      }
    }
    pIVar45->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if ((local_88[0] != '\0') && (pIVar45->NavWindow != (ImGuiWindow *)0x0)) {
    ClearActiveID();
    pIVar46 = pIVar45->NavWindow;
    pIVar52 = pIVar46;
    do {
      window = pIVar52;
      if ((window->ParentWindow == (ImGuiWindow *)0x0) ||
         (((window->DC).NavLayersActiveMask & 2) != 0)) break;
      pIVar52 = window->ParentWindow;
    } while ((window->Flags & 0x15000000U) == 0x1000000);
    if (window != pIVar46) {
      FocusWindow(window);
      window->NavLastChildNavWindow = pIVar46;
    }
    IVar57 = ImGuiNavLayer_Main;
    if (((pIVar45->NavWindow->DC).NavLayersActiveMask & 2) != 0) {
      IVar57 = pIVar45->NavLayer ^ ImGuiNavLayer_Menu;
    }
    if (IVar57 != pIVar45->NavLayer) {
      if (IVar57 == ImGuiNavLayer_Menu) {
        pIVar45->NavWindow->NavLastIds[1] = 0;
      }
      NavRestoreLayer(IVar57);
      pIVar45 = GImGui;
      pIVar45->NavMousePosDirty = true;
      pIVar45->NavDisableHighlight = false;
      pIVar45->NavDisableMouseHover = true;
    }
  }
  cVar59 = (char)uVar48;
  if (((uVar12 & 1) == 0 && cVar59 == '\0') || (pIVar37->NavWindow == (ImGuiWindow *)0x0)) {
    (pIVar37->IO).NavActive = false;
LAB_0013bc7d:
    bVar41 = pIVar37->NavWindowingTarget != (ImGuiWindow *)0x0;
  }
  else {
    bVar41 = (pIVar37->NavWindow->Flags & 0x40000U) == 0;
    (pIVar37->IO).NavActive = bVar41;
    if (((!bVar41) || (pIVar37->NavId == 0)) ||
       (bVar41 = true, pIVar37->NavDisableHighlight != false)) goto LAB_0013bc7d;
  }
  (pIVar37->IO).NavVisible = bVar41;
  pIVar45 = GImGui;
  fVar66 = (GImGui->IO).NavInputsDownDuration[1];
  if ((fVar66 == 0.0) && (!NAN(fVar66))) {
    if (GImGui->ActiveId == 0) {
      if (GImGui->NavLayer == ImGuiNavLayer_Main) {
        pIVar46 = GImGui->NavWindow;
        if (((pIVar46 == (ImGuiWindow *)0x0) || (pIVar46 == pIVar46->RootWindow)) ||
           (((pIVar46->Flags & 0x4000000) != 0 ||
            (pIVar52 = pIVar46->ParentWindow, pIVar52 == (ImGuiWindow *)0x0)))) {
          iVar53 = (GImGui->OpenPopupStack).Size;
          if ((long)iVar53 < 1) {
            if ((pIVar46 != (ImGuiWindow *)0x0) && ((pIVar46->Flags & 0x5000000U) != 0x1000000)) {
              pIVar46->NavLastIds[0] = 0;
            }
            pIVar45->NavId = 0;
            pIVar45->NavFocusScopeId = 0;
          }
          else if ((((GImGui->OpenPopupStack).Data[(long)iVar53 + -1].Window)->Flags & 0x8000000) ==
                   0) {
            ClosePopupToLevel(iVar53 + -1,true);
          }
          goto LAB_0013bcec;
        }
        if (pIVar46->ChildId == 0) {
          __assert_fail("child_window->ChildId != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                        ,0x28fa,"void ImGui::NavUpdateCancelRequest()");
        }
        fVar66 = (pIVar46->Pos).x;
        local_58 = ZEXT416((uint)fVar66);
        fVar69 = (pIVar46->Pos).y;
        local_48 = ZEXT416((uint)fVar69);
        fVar76 = (pIVar46->Size).x;
        fVar68 = (pIVar46->Size).y;
        FocusWindow(pIVar52);
        fVar70 = (pIVar52->DC).CursorStartPos.x;
        fVar67 = (pIVar52->DC).CursorStartPos.y;
        local_70.Min.x = (float)local_58._0_4_ - fVar70;
        local_70.Min.y = (float)local_48._0_4_ - fVar67;
        local_70.Max.y = (fVar68 + fVar69) - fVar67;
        local_70.Max.x = (fVar76 + fVar66) - fVar70;
        SetNavID(pIVar46->ChildId,ImGuiNavLayer_Main,0,&local_70);
      }
      else {
        NavRestoreLayer(ImGuiNavLayer_Main);
      }
      pIVar45 = GImGui;
      pIVar45->NavMousePosDirty = true;
      pIVar45->NavDisableHighlight = false;
      pIVar45->NavDisableMouseHover = true;
    }
    else if ((GImGui->ActiveIdUsingNavInputMask & 2) == 0) {
      ClearActiveID();
    }
  }
LAB_0013bcec:
  pIVar37->NavActivateId = 0;
  pIVar37->NavActivateDownId = 0;
  pIVar37->NavActivatePressedId = 0;
  pIVar37->NavActivateInputId = 0;
  pIVar37->NavActivateFlags = 0;
  IVar54 = pIVar37->NavId;
  if ((((IVar54 != 0) && (pIVar37->NavDisableHighlight == false)) &&
      (pIVar37->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
     ((pIVar37->NavWindow != (ImGuiWindow *)0x0 && ((pIVar37->NavWindow->Flags & 0x40000) == 0)))) {
    fVar66 = (GImGui->IO).NavInputs[0];
    if (0.0 < fVar66) {
      bVar41 = (GImGui->IO).NavInputsDownDuration[0] == 0.0;
    }
    else {
      bVar41 = false;
    }
    if ((GImGui->IO).NavInputs[2] <= 0.0) {
      bVar40 = false;
    }
    else {
      bVar40 = (GImGui->IO).NavInputsDownDuration[2] == 0.0;
    }
    IVar13 = pIVar37->ActiveId;
    if (bVar41 && IVar13 == 0) {
      pIVar37->NavActivateId = IVar54;
      pIVar37->NavActivateFlags = 2;
    }
    if (IVar13 == 0) {
      if (bVar40) goto LAB_0013c40e;
    }
    else if ((bool)(bVar40 & IVar13 == IVar54)) {
LAB_0013c40e:
      pIVar37->NavActivateInputId = IVar54;
      pIVar37->NavActivateFlags = 1;
    }
    if (IVar13 == 0) {
      if (0.0 < fVar66) goto LAB_0013c439;
    }
    else if (IVar13 == IVar54 && 0.0 < fVar66) {
LAB_0013c439:
      pIVar37->NavActivateDownId = IVar54;
    }
    if (IVar13 == 0) {
      if (bVar41) goto LAB_0013c469;
    }
    else if ((bool)(bVar41 & IVar13 == IVar54)) {
LAB_0013c469:
      pIVar37->NavActivatePressedId = IVar54;
    }
  }
  if ((pIVar37->NavWindow != (ImGuiWindow *)0x0) && ((pIVar37->NavWindow->Flags & 0x40000) != 0)) {
    pIVar37->NavDisableHighlight = true;
  }
  if ((pIVar37->NavActivateId != 0) && (pIVar37->NavActivateDownId != pIVar37->NavActivateId)) {
    __assert_fail("g.NavActivateDownId == g.NavActivateId",
                  "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                  ,0x27a8,"void ImGui::NavUpdate()");
  }
  IVar54 = pIVar37->NavNextActivateId;
  if (IVar54 != 0) {
    if ((pIVar37->NavNextActivateFlags & 1U) == 0) {
      pIVar37->NavActivatePressedId = IVar54;
      pIVar37->NavActivateDownId = IVar54;
      pIVar37->NavActivateId = IVar54;
    }
    else {
      pIVar37->NavActivateInputId = IVar54;
    }
    pIVar37->NavActivateFlags = pIVar37->NavNextActivateFlags;
  }
  pIVar37->NavNextActivateId = 0;
  pIVar45 = GImGui;
  pIVar46 = GImGui->NavWindow;
  if ((pIVar46 != (ImGuiWindow *)0x0 & GImGui->NavMoveForwardToNextFrame) == 1) {
    if ((GImGui->NavMoveDir == -1) || (GImGui->NavMoveClipDir == -1)) {
      __assert_fail("g.NavMoveDir != ImGuiDir_None && g.NavMoveClipDir != ImGuiDir_None",
                    "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                    ,0x280b,"void ImGui::NavUpdateCreateMoveRequest()");
    }
    if ((GImGui->NavMoveFlags & 0x80) == 0) {
      __assert_fail("g.NavMoveFlags & ImGuiNavMoveFlags_Forwarded",
                    "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                    ,0x280c,"void ImGui::NavUpdateCreateMoveRequest()");
    }
  }
  else {
    GImGui->NavMoveDir = -1;
    pIVar45->NavMoveFlags = 0;
    pIVar45->NavMoveScrollFlags = 0;
    if (((pIVar46 != (ImGuiWindow *)0x0) && (pIVar45->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
       ((pIVar46->Flags & 0x40000) == 0)) {
      uVar48 = pIVar45->ActiveIdUsingNavDirMask;
      if (((uVar48 & 1) == 0) &&
         ((fVar66 = GetNavInputAmount(4,ImGuiInputReadMode_Repeat), 0.0 < fVar66 ||
          (fVar66 = GetNavInputAmount(0x10,ImGuiInputReadMode_Repeat), 0.0 < fVar66)))) {
        pIVar45->NavMoveDir = 0;
      }
      if (((uVar48 & 2) == 0) &&
         ((fVar66 = GetNavInputAmount(5,ImGuiInputReadMode_Repeat), 0.0 < fVar66 ||
          (fVar66 = GetNavInputAmount(0x11,ImGuiInputReadMode_Repeat), 0.0 < fVar66)))) {
        pIVar45->NavMoveDir = 1;
      }
      if (((uVar48 & 4) == 0) &&
         ((fVar66 = GetNavInputAmount(6,ImGuiInputReadMode_Repeat), 0.0 < fVar66 ||
          (fVar66 = GetNavInputAmount(0x12,ImGuiInputReadMode_Repeat), 0.0 < fVar66)))) {
        pIVar45->NavMoveDir = 2;
      }
      if (((uVar48 & 8) == 0) &&
         ((fVar66 = GetNavInputAmount(7,ImGuiInputReadMode_Repeat), 0.0 < fVar66 ||
          (fVar66 = GetNavInputAmount(0x13,ImGuiInputReadMode_Repeat), 0.0 < fVar66)))) {
        pIVar45->NavMoveDir = 3;
      }
    }
    pIVar45->NavMoveClipDir = pIVar45->NavMoveDir;
    (pIVar45->NavScoringNoClipRect).Min.x = 3.4028235e+38;
    (pIVar45->NavScoringNoClipRect).Min.y = 3.4028235e+38;
    (pIVar45->NavScoringNoClipRect).Max.x = -3.4028235e+38;
    (pIVar45->NavScoringNoClipRect).Max.y = -3.4028235e+38;
  }
  fVar66 = 0.0;
  if ((((pIVar46 != (ImGuiWindow *)0x0) && (pIVar45->NavMoveDir == -1)) &&
      (((pIVar45->IO).ConfigFlags & 1U) != 0)) &&
     (((pIVar46->Flags & 0x40000) == 0 && (pIVar45->NavWindowingTarget == (ImGuiWindow *)0x0)))) {
    bVar41 = false;
    bVar40 = false;
    if ((pIVar45->IO).KeysData[0x205].Down == true) {
      bVar40 = ((pIVar45->ActiveIdUsingKeyInputMask).Storage[0] & 0x20) == 0;
    }
    if ((pIVar45->IO).KeysData[0x206].Down == true) {
      bVar41 = ((pIVar45->ActiveIdUsingKeyInputMask).Storage[0] & 0x40) == 0;
    }
    bVar42 = IsKeyPressed(0x207,true);
    if (bVar42) {
      local_58._0_4_ =
           (int)CONCAT71((int7)((ulong)GImGui >> 8),
                         ((GImGui->ActiveIdUsingKeyInputMask).Storage[0] & 0x80) == 0);
    }
    else {
      auVar34._12_4_ = 0;
      auVar34._0_12_ = local_58._4_12_;
      local_58 = auVar34 << 0x20;
    }
    bVar42 = IsKeyPressed(0x208,true);
    if (bVar42) {
      bVar42 = ((GImGui->ActiveIdUsingKeyInputMask).Storage[0] & 0x100) == 0;
    }
    else {
      bVar42 = false;
    }
    if ((bVar40 != bVar41) || (fVar66 = 0.0, (bool)local_58[0] != bVar42)) {
      if (pIVar45->NavLayer != ImGuiNavLayer_Main) {
        NavRestoreLayer(ImGuiNavLayer_Main);
      }
      if (((pIVar46->DC).NavLayersActiveMask == 0) && ((pIVar46->DC).NavHasScroll == true)) {
        bVar41 = IsKeyPressed(0x205,true);
        if (bVar41) {
          fVar66 = (pIVar46->Scroll).y - ((pIVar46->InnerRect).Max.y - (pIVar46->InnerRect).Min.y);
        }
        else {
          bVar41 = IsKeyPressed(0x206,true);
          if (!bVar41) {
            if (local_58[0] == '\0') {
              fVar66 = 0.0;
              if (bVar42 != false) {
                (pIVar46->ScrollTarget).y = (pIVar46->ScrollMax).y;
                (pIVar46->ScrollTargetCenterRatio).y = 0.0;
                (pIVar46->ScrollTargetEdgeSnapDist).y = 0.0;
              }
            }
            else {
              (pIVar46->ScrollTarget).y = 0.0;
              (pIVar46->ScrollTargetCenterRatio).y = 0.0;
              (pIVar46->ScrollTargetEdgeSnapDist).y = 0.0;
              fVar66 = 0.0;
            }
            goto LAB_0013c589;
          }
          fVar66 = ((pIVar46->InnerRect).Max.y - (pIVar46->InnerRect).Min.y) + (pIVar46->Scroll).y;
        }
        (pIVar46->ScrollTarget).y = fVar66;
        (pIVar46->ScrollTargetCenterRatio).y = 0.0;
        (pIVar46->ScrollTargetEdgeSnapDist).y = 0.0;
        fVar66 = 0.0;
      }
      else {
        IVar57 = pIVar45->NavLayer;
        pIVar55 = pIVar46->NavRectRel + IVar57;
        fVar66 = GImGui->FontBaseSize * pIVar46->FontWindowScale;
        if (pIVar46->ParentWindow != (ImGuiWindow *)0x0) {
          fVar66 = fVar66 * pIVar46->ParentWindow->FontWindowScale;
        }
        fVar66 = (pIVar46->NavRectRel[IVar57].Max.y - pIVar46->NavRectRel[IVar57].Min.y) +
                 (((pIVar46->InnerRect).Max.y - (pIVar46->InnerRect).Min.y) - fVar66);
        fVar66 = (float)(~-(uint)(fVar66 <= 0.0) & (uint)fVar66);
        bVar41 = IsKeyPressed(0x205,true);
        if (bVar41) {
          fVar66 = -fVar66;
          pIVar45->NavMoveDir = 3;
          pIVar45->NavMoveClipDir = 2;
          pIVar45->NavMoveFlags = 0x30;
        }
        else {
          bVar41 = IsKeyPressed(0x206,true);
          if (bVar41) {
            pIVar45->NavMoveDir = 2;
            pIVar45->NavMoveClipDir = 3;
            pIVar45->NavMoveFlags = 0x30;
          }
          else {
            if (local_58[0] == '\0') {
              if (bVar42 != false) {
                fVar66 = (pIVar46->ContentSize).y;
                pIVar46->NavRectRel[IVar57].Max.y = fVar66;
                pIVar46->NavRectRel[IVar57].Min.y = fVar66;
                fVar66 = (pIVar55->Min).x;
                pIVar1 = &pIVar46->NavRectRel[IVar57].Max;
                if (pIVar1->x <= fVar66 && fVar66 != pIVar1->x) {
                  pIVar46->NavRectRel[IVar57].Max.x = 0.0;
                  (pIVar55->Min).x = 0.0;
                }
                pIVar45->NavMoveDir = 2;
                pIVar45->NavMoveFlags = 0x50;
              }
            }
            else {
              pIVar46->NavRectRel[IVar57].Max.y = 0.0;
              pIVar46->NavRectRel[IVar57].Min.y = 0.0;
              fVar66 = (pIVar55->Min).x;
              pIVar1 = &pIVar46->NavRectRel[IVar57].Max;
              if (pIVar1->x <= fVar66 && fVar66 != pIVar1->x) {
                pIVar46->NavRectRel[IVar57].Max.x = 0.0;
                (pIVar55->Min).x = 0.0;
              }
              pIVar45->NavMoveDir = 3;
              pIVar45->NavMoveFlags = 0x50;
            }
            fVar66 = 0.0;
          }
        }
      }
    }
  }
LAB_0013c589:
  if ((fVar66 != 0.0) || (NAN(fVar66))) {
    IVar31 = (pIVar46->InnerRect).Max;
    (pIVar45->NavScoringNoClipRect).Min = (pIVar46->InnerRect).Min;
    (pIVar45->NavScoringNoClipRect).Max = IVar31;
    (pIVar45->NavScoringNoClipRect).Min.y = (pIVar45->NavScoringNoClipRect).Min.y + fVar66;
    (pIVar45->NavScoringNoClipRect).Max.y = (pIVar45->NavScoringNoClipRect).Max.y + fVar66;
  }
  pIVar45->NavMoveForwardToNextFrame = false;
  if (pIVar45->NavMoveDir != -1) {
    NavMoveRequestSubmit
              (pIVar45->NavMoveDir,pIVar45->NavMoveClipDir,pIVar45->NavMoveFlags,
               pIVar45->NavMoveScrollFlags);
  }
  if (pIVar45->NavMoveSubmitted == true) {
    if (pIVar45->NavId == 0) {
      pIVar45->NavInitRequest = true;
      pIVar45->NavInitRequestFromMove = true;
      pIVar45->NavInitResultId = 0;
      pIVar45->NavDisableHighlight = false;
    }
    if ((pIVar45->NavInputSource == ImGuiInputSource_Gamepad) &&
       (uVar49 = (ulong)pIVar45->NavLayer, uVar49 == 0 && pIVar46 != (ImGuiWindow *)0x0)) {
      uVar48 = pIVar45->NavMoveFlags;
      fVar69 = (pIVar46->DC).CursorStartPos.x;
      fVar76 = (pIVar46->DC).CursorStartPos.y;
      local_70.Min.x = ((pIVar46->InnerRect).Min.x + -1.0) - fVar69;
      fVar68 = ((pIVar46->InnerRect).Min.y + -1.0) - fVar76;
      local_70.Min.y = fVar68;
      local_70.Max.x = ((pIVar46->InnerRect).Max.x + 1.0) - fVar69;
      fVar76 = ((pIVar46->InnerRect).Max.y + 1.0) - fVar76;
      local_70.Max.y = fVar76;
      if ((uVar48 & 5) == 0 || (uVar48 & 10) == 0) {
        if ((((pIVar46->NavRectRel[uVar49].Min.x < local_70.Min.x) ||
             (pIVar46->NavRectRel[uVar49].Min.y < fVar68)) ||
            (local_70.Max.x < pIVar46->NavRectRel[uVar49].Max.x)) ||
           (fVar76 < pIVar46->NavRectRel[uVar49].Max.y)) {
          fVar70 = GImGui->FontBaseSize * pIVar46->FontWindowScale;
          pIVar52 = pIVar46->ParentWindow;
          fVar69 = fVar70;
          if (pIVar52 != (ImGuiWindow *)0x0) {
            fVar69 = pIVar52->FontWindowScale * fVar70;
          }
          if (pIVar52 != (ImGuiWindow *)0x0) {
            fVar70 = fVar70 * pIVar52->FontWindowScale;
          }
          fVar67 = local_70.Max.x - local_70.Min.x;
          if (fVar69 * 0.5 <= local_70.Max.x - local_70.Min.x) {
            fVar67 = fVar69 * 0.5;
          }
          local_70.Min.y = -3.4028235e+38;
          bVar41 = (uVar48 & 5) == 0;
          if (bVar41) {
            local_70.Min.x = local_70.Min.x + fVar67;
          }
          else {
            local_70.Min.x = -3.4028235e+38;
          }
          local_70.Max.y = 3.4028235e+38;
          if (bVar41) {
            local_70.Max.x = local_70.Max.x - fVar67;
          }
          else {
            local_70.Max.x = 3.4028235e+38;
          }
          fVar69 = fVar76 - fVar68;
          if (fVar70 * 0.5 <= fVar76 - fVar68) {
            fVar69 = fVar70 * 0.5;
          }
          bVar41 = (uVar48 & 10) == 0;
          if (bVar41) {
            local_70.Min.y = fVar68 + fVar69;
          }
          if (bVar41) {
            local_70.Max.y = fVar76 - fVar69;
          }
          ImRect::ClipWithFull(pIVar46->NavRectRel + uVar49,&local_70);
          pIVar45->NavId = 0;
          pIVar45->NavFocusScopeId = 0;
        }
      }
    }
  }
  if (pIVar46 == (ImGuiWindow *)0x0) {
    fVar69 = 0.0;
    fVar66 = 0.0;
    IVar74.x = 0.0;
    IVar74.y = 0.0;
  }
  else {
    IVar57 = pIVar45->NavLayer;
    fVar69 = pIVar46->NavRectRel[IVar57].Max.x;
    fVar76 = pIVar46->NavRectRel[IVar57].Min.x;
    fVar68 = pIVar46->NavRectRel[IVar57].Min.y;
    fVar70 = pIVar46->NavRectRel[IVar57].Max.y;
    fVar67 = 0.0;
    fVar75 = 0.0;
    fVar71 = 0.0;
    fVar72 = 0.0;
    if (fVar76 <= fVar69 && fVar68 <= fVar70) {
      fVar67 = fVar76;
      fVar75 = fVar68;
      fVar71 = fVar70;
      fVar72 = fVar69;
    }
    fVar69 = (pIVar46->DC).CursorStartPos.y;
    fVar76 = fVar75 + fVar69 + fVar66;
    fVar66 = fVar71 + fVar69 + fVar66;
    if (fVar66 < fVar76) {
      __assert_fail("!scoring_rect.IsInverted()",
                    "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                    ,0x2865,"void ImGui::NavUpdateCreateMoveRequest()");
    }
    fVar69 = (pIVar46->DC).CursorStartPos.x;
    fVar72 = fVar72 + fVar69;
    fVar69 = fVar67 + fVar69 + 1.0;
    if (fVar72 <= fVar69) {
      fVar69 = fVar72;
    }
    IVar74.y = fVar76;
    IVar74.x = fVar69;
  }
  IVar25.y = fVar66;
  IVar25.x = fVar69;
  (pIVar45->NavScoringRect).Min = IVar74;
  (pIVar45->NavScoringRect).Max = IVar25;
  if (IVar74.x < (pIVar45->NavScoringNoClipRect).Min.x) {
    (pIVar45->NavScoringNoClipRect).Min.x = IVar74.x;
  }
  if (IVar74.y < (pIVar45->NavScoringNoClipRect).Min.y) {
    (pIVar45->NavScoringNoClipRect).Min.y = IVar74.y;
  }
  pIVar1 = &(pIVar45->NavScoringNoClipRect).Max;
  if (pIVar1->x <= fVar69 && fVar69 != pIVar1->x) {
    (pIVar45->NavScoringNoClipRect).Max.x = fVar69;
  }
  pfVar3 = &(pIVar45->NavScoringNoClipRect).Max.y;
  if (*pfVar3 <= fVar66 && fVar66 != *pfVar3) {
    (pIVar45->NavScoringNoClipRect).Max.y = fVar66;
  }
  pIVar45 = GImGui;
  if (pIVar37->NavMoveDir == -1) {
    if (GImGui->NavMoveDir != -1) {
      __assert_fail("g.NavMoveDir == ImGuiDir_None",
                    "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                    ,0x2871,"void ImGui::NavUpdateCreateTabbingRequest()");
    }
    pIVar46 = GImGui->NavWindow;
    if (((((pIVar46 != (ImGuiWindow *)0x0) && (GImGui->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
         (((pIVar46->Flags & 0x40000) == 0 &&
          ((bVar41 = IsKeyPressed(0x200,true), bVar41 &&
           (((GImGui->ActiveIdUsingKeyInputMask).Storage[0] & 1) == 0)))))) &&
        ((pIVar45->IO).KeyCtrl == false)) && ((pIVar45->IO).KeyAlt == false)) {
      uVar48 = 0xffffffff;
      if ((pIVar45->IO).KeyShift == false) {
        uVar48 = (uint)(pIVar45->ActiveId != 0);
      }
      pIVar45->NavTabbingDir = uVar48;
      scroll_flags = 3;
      if (pIVar46->Appearing != false) {
        scroll_flags = 0x21;
      }
      NavMoveRequestSubmit(-1,uVar48 >> 0x1f ^ 3,0x400,scroll_flags);
      (pIVar45->NavTabbingResultFirst).InFlags = 0;
      (pIVar45->NavTabbingResultFirst).DistBox = 3.4028235e+38;
      (pIVar45->NavTabbingResultFirst).Window = (ImGuiWindow *)0x0;
      (pIVar45->NavTabbingResultFirst).ID = 0;
      (pIVar45->NavTabbingResultFirst).FocusScopeId = 0;
      (pIVar45->NavTabbingResultFirst).DistCenter = 3.4028235e+38;
      (pIVar45->NavTabbingResultFirst).DistAxial = 3.4028235e+38;
      pIVar45->NavTabbingCounter = -1;
    }
  }
  pIVar45 = GImGui;
  if (GImGui->NavMoveScoringItems == false) {
    pbVar8 = &GImGui->NavInitRequest;
    GImGui->NavAnyRequest = *pbVar8;
    if (*pbVar8 != false) goto LAB_0013c992;
  }
  else {
    GImGui->NavAnyRequest = true;
LAB_0013c992:
    if (pIVar45->NavWindow == (ImGuiWindow *)0x0) {
      __assert_fail("g.NavWindow != __null",
                    "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                    ,0x26bb,"void ImGui::NavUpdateAnyRequestFlag()");
    }
  }
  pIVar37->NavIdIsAlive = false;
  pIVar46 = pIVar37->NavWindow;
  if (((pIVar46 != (ImGuiWindow *)0x0) && ((pIVar46->Flags & 0x40000) == 0)) &&
     (pIVar37->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    fVar66 = pIVar45->FontBaseSize * pIVar46->FontWindowScale;
    if (pIVar46->ParentWindow != (ImGuiWindow *)0x0) {
      fVar66 = fVar66 * pIVar46->ParentWindow->FontWindowScale;
    }
    fVar66 = (float)(int)(fVar66 * 100.0 * (pIVar37->IO).DeltaTime + 0.5);
    if (((pIVar46->DC).NavLayersActiveMask == 0) &&
       (uVar48 = pIVar37->NavMoveDir, (uVar48 != 0xffffffff & (pIVar46->DC).NavHasScroll) == 1)) {
      if (uVar48 < 2) {
        (pIVar46->ScrollTarget).x =
             (float)(int)(*(float *)(&DAT_0019a638 + (ulong)(uVar48 == 0) * 4) * fVar66 +
                         (pIVar46->Scroll).x);
        (pIVar46->ScrollTargetCenterRatio).x = 0.0;
        (pIVar46->ScrollTargetEdgeSnapDist).x = 0.0;
      }
      if ((uVar48 & 0xfffffffe) == 2) {
        (pIVar46->ScrollTarget).y =
             (float)(int)(*(float *)(&DAT_0019a638 + (ulong)(uVar48 == 2) * 4) * fVar66 +
                         (pIVar46->Scroll).y);
        (pIVar46->ScrollTargetCenterRatio).y = 0.0;
        (pIVar46->ScrollTargetEdgeSnapDist).y = 0.0;
      }
    }
    IVar31 = GetNavInputAmount2d(8,ImGuiInputReadMode_Down,0.1,10.0);
    fVar69 = IVar31.x;
    fVar76 = IVar31.y;
    if (((fVar69 != 0.0) || (NAN(fVar69))) && (pIVar46->ScrollbarX == true)) {
      (pIVar46->ScrollTarget).x = (float)(int)(fVar69 * fVar66 + (pIVar46->Scroll).x);
      (pIVar46->ScrollTargetCenterRatio).x = 0.0;
      (pIVar46->ScrollTargetEdgeSnapDist).x = 0.0;
    }
    if ((fVar76 != 0.0) || (NAN(fVar76))) {
      (pIVar46->ScrollTarget).y = (float)(int)(fVar76 * fVar66 + (pIVar46->Scroll).y);
      (pIVar46->ScrollTargetCenterRatio).y = 0.0;
      (pIVar46->ScrollTargetEdgeSnapDist).y = 0.0;
    }
  }
  if ((uVar12 & 1) == 0 && cVar59 == '\0') {
    pIVar37->NavDisableHighlight = true;
    pIVar37->NavDisableMouseHover = false;
  }
  else if ((((char)local_5c != '\0') && (((pIVar37->IO).ConfigFlags & 4) != 0)) &&
          (((pIVar37->IO).BackendFlags & 4) != 0)) {
    IVar31 = NavCalcPreferredRefPos();
    (pIVar37->IO).MousePosPrev = IVar31;
    (pIVar37->IO).MousePos = IVar31;
    (pIVar37->IO).WantSetMousePos = true;
  }
  pIVar37->NavScoringDebugCount = 0;
  pIVar45 = GImGui;
  pIVar1 = &(GImGui->IO).MousePos;
  bVar41 = IsMousePosValid(pIVar1);
  if (!bVar41) goto LAB_0013cc1d;
  fVar66 = pIVar1->x;
  if (0.0 <= fVar66) {
LAB_0013cbcd:
    iVar53 = (int)fVar66;
  }
  else {
    if ((fVar66 == (float)(int)fVar66) && (!NAN(fVar66) && !NAN((float)(int)fVar66)))
    goto LAB_0013cbcd;
    iVar53 = (int)fVar66 + -1;
  }
  fVar66 = (pIVar45->IO).MousePos.y;
  if (0.0 <= fVar66) {
LAB_0013cbf8:
    iVar44 = (int)fVar66;
  }
  else {
    if ((fVar66 == (float)(int)fVar66) && (!NAN(fVar66) && !NAN((float)(int)fVar66)))
    goto LAB_0013cbf8;
    iVar44 = (int)fVar66 + -1;
  }
  IVar26.y = (float)iVar44;
  IVar26.x = (float)iVar53;
  pIVar45->MouseLastValidPos = IVar26;
  IVar27.y = (float)iVar44;
  IVar27.x = (float)iVar53;
  (pIVar45->IO).MousePos = IVar27;
LAB_0013cc1d:
  bVar41 = IsMousePosValid(pIVar1);
  if ((bVar41) && (bVar41 = IsMousePosValid(&(pIVar45->IO).MousePosPrev), bVar41)) {
    IVar28.y = (pIVar45->IO).MousePos.y - (pIVar45->IO).MousePosPrev.y;
    IVar28.x = (pIVar45->IO).MousePos.x - (pIVar45->IO).MousePosPrev.x;
    (pIVar45->IO).MouseDelta = IVar28;
  }
  else {
    (pIVar45->IO).MouseDelta.x = 0.0;
    (pIVar45->IO).MouseDelta.y = 0.0;
  }
  fVar66 = (pIVar45->IO).MouseDelta.x;
  if ((((fVar66 != 0.0) || (NAN(fVar66))) || (fVar66 = (pIVar45->IO).MouseDelta.y, fVar66 != 0.0))
     || (NAN(fVar66))) {
    pIVar45->NavDisableMouseHover = false;
  }
  (pIVar45->IO).MousePosPrev = (pIVar45->IO).MousePos;
  lVar61 = 0;
  do {
    bVar41 = (pIVar45->IO).MouseDown[lVar61];
    if (bVar41 == true) {
      pfVar3 = (pIVar45->IO).MouseDownDuration + lVar61;
      bVar40 = *pfVar3 <= 0.0 && *pfVar3 != 0.0;
    }
    else {
      bVar40 = false;
    }
    (pIVar45->IO).MouseClicked[lVar61] = bVar40;
    (pIVar45->IO).MouseClickedCount[lVar61] = 0;
    if (bVar41 == false) {
      bVar42 = 0.0 <= (pIVar45->IO).MouseDownDuration[lVar61];
    }
    else {
      bVar42 = false;
    }
    (pIVar45->IO).MouseReleased[lVar61] = bVar42;
    fVar66 = (pIVar45->IO).MouseDownDuration[lVar61];
    (pIVar45->IO).MouseDownDurationPrev[lVar61] = fVar66;
    fVar69 = -1.0;
    if ((bVar41 != false) && (fVar69 = 0.0, 0.0 <= fVar66)) {
      fVar69 = fVar66 + (pIVar45->IO).DeltaTime;
    }
    (pIVar45->IO).MouseDownDuration[lVar61] = fVar69;
    if (bVar40 == false) {
      if (bVar41 != false) {
        bVar41 = IsMousePosValid(pIVar1);
        fVar66 = 0.0;
        if (bVar41) {
          fVar66 = (pIVar45->IO).MousePos.x - (pIVar45->IO).MouseClickedPos[lVar61].x;
          fVar69 = (pIVar45->IO).MousePos.y - (pIVar45->IO).MouseClickedPos[lVar61].y;
          fVar66 = fVar66 * fVar66 + fVar69 * fVar69;
        }
        fVar69 = (pIVar45->IO).MouseDragMaxDistanceSqr[lVar61];
        uVar48 = -(uint)(fVar66 <= fVar69);
        (pIVar45->IO).MouseDragMaxDistanceSqr[lVar61] =
             (float)(~uVar48 & (uint)fVar66 | (uint)fVar69 & uVar48);
      }
    }
    else {
      if ((pIVar45->IO).MouseDoubleClickTime <=
          (float)(pIVar45->Time - (pIVar45->IO).MouseClickedTime[lVar61])) {
LAB_0013ce60:
        (pIVar45->IO).MouseClickedLastCount[lVar61] = 1;
      }
      else {
        bVar41 = IsMousePosValid(pIVar1);
        fVar66 = 0.0;
        fVar69 = 0.0;
        if (bVar41) {
          fVar66 = (pIVar45->IO).MousePos.x - (pIVar45->IO).MouseClickedPos[lVar61].x;
          fVar69 = (pIVar45->IO).MousePos.y - (pIVar45->IO).MouseClickedPos[lVar61].y;
        }
        fVar76 = (pIVar45->IO).MouseDoubleClickMaxDist;
        if (fVar76 * fVar76 <= fVar66 * fVar66 + fVar69 * fVar69) goto LAB_0013ce60;
        pIVar9 = (pIVar45->IO).MouseClickedLastCount + lVar61;
        *pIVar9 = *pIVar9 + 1;
      }
      (pIVar45->IO).MouseClickedTime[lVar61] = pIVar45->Time;
      (pIVar45->IO).MouseClickedPos[lVar61] = (pIVar45->IO).MousePos;
      (pIVar45->IO).MouseClickedCount[lVar61] = (pIVar45->IO).MouseClickedLastCount[lVar61];
      (pIVar45->IO).MouseDragMaxDistanceSqr[lVar61] = 0.0;
    }
    (pIVar45->IO).MouseDoubleClicked[lVar61] = (pIVar45->IO).MouseClickedCount[lVar61] == 2;
    if ((pIVar45->IO).MouseClicked[lVar61] == true) {
      pIVar45->NavDisableMouseHover = false;
    }
    lVar61 = lVar61 + 1;
  } while (lVar61 != 5);
  UpdateHoveredWindowAndCaptureFlags();
  UpdateMouseMovingWindowNewFrame();
  pIVar46 = GetTopMostPopupModal();
  if ((pIVar46 != (ImGuiWindow *)0x0) ||
     ((pIVar36->NavWindowingTarget != (ImGuiWindow *)0x0 &&
      (0.0 < pIVar36->NavWindowingHighlightAlpha)))) {
    fVar66 = (pIVar36->IO).DeltaTime * 6.0 + pIVar36->DimBgRatio;
    if (1.0 <= fVar66) {
      fVar66 = 1.0;
    }
    pIVar36->DimBgRatio = fVar66;
  }
  else {
    fVar66 = (pIVar36->IO).DeltaTime * -10.0 + pIVar36->DimBgRatio;
    pIVar36->DimBgRatio = (float)(-(uint)(0.0 <= fVar66) & (uint)fVar66);
  }
  pIVar36->MouseCursor = 0;
  pIVar36->WantTextInputNextFrame = -1;
  pIVar36->WantCaptureMouseNextFrame = -1;
  pIVar36->WantCaptureKeyboardNextFrame = -1;
  uVar39 = *(undefined3 *)&(pIVar36->PlatformImeData).field_0x1;
  fVar66 = (pIVar36->PlatformImeData).InputPos.x;
  uVar32 = *(undefined8 *)&(pIVar36->PlatformImeData).InputPos.y;
  (pIVar36->PlatformImeDataPrev).WantVisible = (pIVar36->PlatformImeData).WantVisible;
  *(undefined3 *)&(pIVar36->PlatformImeDataPrev).field_0x1 = uVar39;
  (pIVar36->PlatformImeDataPrev).InputPos.x = fVar66;
  *(undefined8 *)&(pIVar36->PlatformImeDataPrev).InputPos.y = uVar32;
  (pIVar36->PlatformImeData).WantVisible = false;
  pIVar45 = GImGui;
  if (GImGui->WheelingWindow != (ImGuiWindow *)0x0) {
    GImGui->WheelingWindowTimer = GImGui->WheelingWindowTimer - (GImGui->IO).DeltaTime;
    bVar41 = IsMousePosValid((ImVec2 *)0x0);
    if ((bVar41) &&
       (fVar69 = (pIVar45->IO).MousePos.x - (pIVar45->WheelingWindowRefMousePos).x,
       fVar76 = (pIVar45->IO).MousePos.y - (pIVar45->WheelingWindowRefMousePos).y,
       fVar66 = (pIVar45->IO).MouseDragThreshold,
       fVar66 * fVar66 < fVar69 * fVar69 + fVar76 * fVar76)) {
      pIVar45->WheelingWindowTimer = 0.0;
    }
    if (pIVar45->WheelingWindowTimer <= 0.0) {
      pIVar45->WheelingWindow = (ImGuiWindow *)0x0;
      pIVar45->WheelingWindowTimer = 0.0;
    }
  }
  pIVar37 = GImGui;
  fVar66 = (pIVar45->IO).MouseWheel;
  if ((((fVar66 != 0.0) || (fVar69 = (pIVar45->IO).MouseWheelH, fVar69 != 0.0)) || (NAN(fVar69))) &&
     (((pIVar45->ActiveId == 0 || (pIVar45->ActiveIdUsingMouseWheel == false)) &&
      ((pIVar45->HoveredIdPreviousFrame == 0 ||
       (pIVar45->HoveredIdPreviousFrameUsingMouseWheel == false)))))) {
    pIVar46 = pIVar45->WheelingWindow;
    if (pIVar46 == (ImGuiWindow *)0x0) {
      pIVar46 = pIVar45->HoveredWindow;
    }
    if ((pIVar46 != (ImGuiWindow *)0x0) && (pIVar46->Collapsed == false)) {
      if (((fVar66 == 0.0) && (!NAN(fVar66))) ||
         (((pIVar45->IO).KeyCtrl != true || ((pIVar45->IO).FontAllowUserScaling != true)))) {
        if ((pIVar45->IO).KeyCtrl == false) {
          if ((pIVar45->IO).KeyShift == true) {
            bVar43 = (pIVar45->IO).ConfigMacOSXBehaviors ^ 1;
          }
          else {
            bVar43 = 0;
          }
          fVar69 = 0.0;
          if (bVar43 == 0) {
            fVar69 = fVar66;
          }
          fVar66 = (pIVar45->IO).NavInputs[(ulong)(bVar43 ^ 1) - 3];
          if ((fVar69 != 0.0) || (NAN(fVar69))) {
            if (GImGui->WheelingWindow != pIVar46) {
              GImGui->WheelingWindow = pIVar46;
              pIVar37->WheelingWindowRefMousePos = (pIVar37->IO).MousePos;
              pIVar37->WheelingWindowTimer = 2.0;
            }
            while ((uVar48 = pIVar46->Flags, (uVar48 >> 0x18 & 1) != 0 &&
                   (((uVar48 & 0x210) == 0x10 ||
                    ((fVar76 = (pIVar46->ScrollMax).y, fVar76 == 0.0 && (!NAN(fVar76)))))))) {
              pIVar46 = pIVar46->ParentWindow;
            }
            if ((uVar48 & 0x210) == 0) {
              fVar76 = ((pIVar46->InnerRect).Max.y - (pIVar46->InnerRect).Min.y) * 0.67;
              fVar68 = pIVar37->FontBaseSize * pIVar46->FontWindowScale;
              if (pIVar46->ParentWindow != (ImGuiWindow *)0x0) {
                fVar68 = fVar68 * pIVar46->ParentWindow->FontWindowScale;
              }
              fVar70 = fVar68 * 5.0;
              if (fVar76 <= fVar68 * 5.0) {
                fVar70 = fVar76;
              }
              (pIVar46->ScrollTarget).y = (pIVar46->Scroll).y - fVar69 * (float)(int)fVar70;
              (pIVar46->ScrollTargetCenterRatio).y = 0.0;
              (pIVar46->ScrollTargetEdgeSnapDist).y = 0.0;
            }
          }
          pIVar45 = GImGui;
          if ((fVar66 != 0.0) || (NAN(fVar66))) {
            if (GImGui->WheelingWindow != pIVar46) {
              GImGui->WheelingWindow = pIVar46;
              pIVar45->WheelingWindowRefMousePos = (pIVar45->IO).MousePos;
              pIVar45->WheelingWindowTimer = 2.0;
            }
            while ((uVar48 = pIVar46->Flags, (uVar48 >> 0x18 & 1) != 0 &&
                   (((uVar48 & 0x210) == 0x10 ||
                    ((fVar69 = (pIVar46->ScrollMax).x, fVar69 == 0.0 && (!NAN(fVar69)))))))) {
              pIVar46 = pIVar46->ParentWindow;
            }
            if ((uVar48 & 0x210) == 0) {
              fVar69 = ((pIVar46->InnerRect).Max.x - (pIVar46->InnerRect).Min.x) * 0.67;
              fVar76 = pIVar45->FontBaseSize * pIVar46->FontWindowScale;
              if (pIVar46->ParentWindow != (ImGuiWindow *)0x0) {
                fVar76 = fVar76 * pIVar46->ParentWindow->FontWindowScale;
              }
              fVar68 = fVar76 + fVar76;
              if (fVar69 <= fVar76 + fVar76) {
                fVar68 = fVar69;
              }
              (pIVar46->ScrollTarget).x = (pIVar46->Scroll).x - fVar66 * (float)(int)fVar68;
              (pIVar46->ScrollTargetCenterRatio).x = 0.0;
              (pIVar46->ScrollTargetEdgeSnapDist).x = 0.0;
            }
          }
        }
      }
      else {
        if (GImGui->WheelingWindow != pIVar46) {
          GImGui->WheelingWindow = pIVar46;
          pIVar37->WheelingWindowRefMousePos = (pIVar37->IO).MousePos;
          pIVar37->WheelingWindowTimer = 2.0;
        }
        fVar66 = pIVar46->FontWindowScale;
        fVar76 = (pIVar45->IO).MouseWheel * 0.1 + fVar66;
        fVar69 = 2.5;
        if (fVar76 <= 2.5) {
          fVar69 = fVar76;
        }
        fVar69 = (float)(-(uint)(fVar76 < 0.5) & 0x3f000000 | ~-(uint)(fVar76 < 0.5) & (uint)fVar69)
        ;
        pIVar46->FontWindowScale = fVar69;
        if (pIVar46 == pIVar46->RootWindow) {
          fVar69 = fVar69 / fVar66;
          fVar66 = (pIVar46->Size).x;
          fVar76 = (pIVar46->Size).y;
          fVar68 = (pIVar46->Pos).x;
          fVar70 = (pIVar46->Pos).y;
          local_70.Min.y =
               (((pIVar45->IO).MousePos.y - fVar70) * (1.0 - fVar69) * fVar76) / fVar76 + fVar70;
          local_70.Min.x =
               (((pIVar45->IO).MousePos.x - fVar68) * (1.0 - fVar69) * fVar66) / fVar66 + fVar68;
          SetWindowPos(pIVar46,&local_70.Min,0);
          IVar29.y = (float)(int)((pIVar46->Size).y * fVar69);
          IVar29.x = (float)(int)((pIVar46->Size).x * fVar69);
          pIVar46->Size = IVar29;
          IVar30.y = (float)(int)(fVar69 * (pIVar46->SizeFull).y);
          IVar30.x = (float)(int)((pIVar46->SizeFull).x * fVar69);
          pIVar46->SizeFull = IVar30;
        }
      }
    }
  }
  if ((pIVar36->Windows).Size < (pIVar36->WindowsFocusOrder).Size) {
    __assert_fail("g.WindowsFocusOrder.Size <= g.Windows.Size",
                  "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                  ,0x111a,"void ImGui::NewFrame()");
  }
  local_98 = 3.4028235e+38;
  if ((pIVar36->GcCompactAll == false) &&
     (fVar66 = (pIVar36->IO).ConfigMemoryCompactTimer, 0.0 <= fVar66)) {
    local_98 = (float)pIVar36->Time - fVar66;
  }
  uVar48 = (pIVar36->Windows).Size;
  uVar49 = (ulong)uVar48;
  if (uVar48 != 0) {
    uVar64 = 0;
    do {
      if ((long)(int)uVar49 <= (long)uVar64) {
        pcVar50 = "T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]";
        goto LAB_0013de8e;
      }
      pIVar46 = (pIVar36->Windows).Data[uVar64];
      bVar41 = pIVar46->Active;
      pIVar46->WasActive = bVar41;
      pIVar46->BeginCount = 0;
      pIVar46->Active = false;
      pIVar46->WriteAccessed = false;
      if (((bVar41 == false) && (pIVar46->MemoryCompacted == false)) &&
         (pIVar46->LastTimeActive <= local_98 && local_98 != pIVar46->LastTimeActive)) {
        GcCompactTransientWindowBuffers(pIVar46);
      }
      uVar64 = uVar64 + 1;
      uVar49 = (ulong)(uint)(pIVar36->Windows).Size;
    } while (uVar64 != uVar49);
  }
  if (0 < (pIVar36->TablesLastTimeActive).Size) {
    lVar61 = 0;
    lVar63 = 0;
    do {
      fVar66 = (pIVar36->TablesLastTimeActive).Data[lVar63];
      if ((0.0 <= fVar66) && (fVar66 < local_98)) {
        if ((pIVar36->Tables).Buf.Size <= lVar63) {
          pcVar50 = "T &ImVector<ImGuiTable>::operator[](int) [T = ImGuiTable]";
          goto LAB_0013de8e;
        }
        TableGcCompactTransientBuffers
                  ((ImGuiTable *)((long)&((pIVar36->Tables).Buf.Data)->ID + lVar61));
      }
      lVar63 = lVar63 + 1;
      lVar61 = lVar61 + 0x208;
    } while (lVar63 < (pIVar36->TablesLastTimeActive).Size);
  }
  if (0 < (pIVar36->TablesTempData).Size) {
    lVar61 = 0;
    lVar63 = 0;
    do {
      pIVar19 = (pIVar36->TablesTempData).Data;
      fVar66 = *(float *)((long)&pIVar19->LastTimeActive + lVar61);
      if ((0.0 <= fVar66) && (fVar66 < local_98)) {
        TableGcCompactTransientBuffers((ImGuiTableTempData *)((long)&pIVar19->TableIndex + lVar61));
      }
      lVar63 = lVar63 + 1;
      lVar61 = lVar61 + 0x70;
    } while (lVar63 < (pIVar36->TablesTempData).Size);
  }
  if (pIVar36->GcCompactAll != false) {
    GcCompactTransientMiscBuffers();
  }
  pIVar36->GcCompactAll = false;
  if ((pIVar36->NavWindow != (ImGuiWindow *)0x0) && (pIVar36->NavWindow->WasActive == false)) {
    FocusTopMostWindowUnderOne((ImGuiWindow *)0x0,(ImGuiWindow *)0x0);
  }
  iVar53 = (pIVar36->CurrentWindowStack).Capacity;
  if (iVar53 < 0) {
    uVar48 = iVar53 / 2 + iVar53;
    uVar49 = 0;
    if (0 < (int)uVar48) {
      uVar49 = (ulong)uVar48;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar22 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar22 = *piVar22 + 1;
    }
    __dest = (ImGuiWindowStackData *)(*GImAllocatorAllocFunc)(uVar49 * 0x58,GImAllocatorUserData);
    pIVar20 = (pIVar36->CurrentWindowStack).Data;
    if (pIVar20 != (ImGuiWindowStackData *)0x0) {
      memcpy(__dest,pIVar20,(long)(pIVar36->CurrentWindowStack).Size * 0x58);
      pIVar20 = (pIVar36->CurrentWindowStack).Data;
      if ((pIVar20 != (ImGuiWindowStackData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar22 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar22 = *piVar22 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar20,GImAllocatorUserData);
    }
    (pIVar36->CurrentWindowStack).Data = __dest;
    (pIVar36->CurrentWindowStack).Capacity = (int)uVar49;
  }
  (pIVar36->CurrentWindowStack).Size = 0;
  iVar53 = (pIVar36->BeginPopupStack).Capacity;
  if (iVar53 < 0) {
    uVar48 = iVar53 / 2 + iVar53;
    uVar49 = 0;
    if (0 < (int)uVar48) {
      uVar49 = (ulong)uVar48;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar22 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar22 = *piVar22 + 1;
    }
    __dest_00 = (ImGuiPopupData *)(*GImAllocatorAllocFunc)(uVar49 * 0x30,GImAllocatorUserData);
    pIVar21 = (pIVar36->BeginPopupStack).Data;
    if (pIVar21 != (ImGuiPopupData *)0x0) {
      memcpy(__dest_00,pIVar21,(long)(pIVar36->BeginPopupStack).Size * 0x30);
      pIVar21 = (pIVar36->BeginPopupStack).Data;
      if ((pIVar21 != (ImGuiPopupData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar22 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar22 = *piVar22 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar21,GImAllocatorUserData);
    }
    (pIVar36->BeginPopupStack).Data = __dest_00;
    (pIVar36->BeginPopupStack).Capacity = (int)uVar49;
  }
  (pIVar36->BeginPopupStack).Size = 0;
  iVar53 = (pIVar36->ItemFlagsStack).Capacity;
  if (iVar53 < 0) {
    uVar48 = iVar53 / 2 + iVar53;
    uVar49 = 0;
    if (0 < (int)uVar48) {
      uVar49 = (ulong)uVar48;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar22 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar22 = *piVar22 + 1;
    }
    piVar47 = (int *)(*GImAllocatorAllocFunc)(uVar49 * 4,GImAllocatorUserData);
    piVar22 = (pIVar36->ItemFlagsStack).Data;
    if (piVar22 != (int *)0x0) {
      memcpy(piVar47,piVar22,(long)(pIVar36->ItemFlagsStack).Size << 2);
      piVar22 = (pIVar36->ItemFlagsStack).Data;
      if ((piVar22 != (int *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar5 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar5 = *piVar5 + -1;
      }
      (*GImAllocatorFreeFunc)(piVar22,GImAllocatorUserData);
    }
    (pIVar36->ItemFlagsStack).Data = piVar47;
    (pIVar36->ItemFlagsStack).Capacity = (int)uVar49;
  }
  (pIVar36->ItemFlagsStack).Size = 0;
  if ((pIVar36->ItemFlagsStack).Capacity == 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar22 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar22 = *piVar22 + 1;
    }
    piVar47 = (int *)(*GImAllocatorAllocFunc)(0x20,GImAllocatorUserData);
    piVar22 = (pIVar36->ItemFlagsStack).Data;
    if (piVar22 != (int *)0x0) {
      memcpy(piVar47,piVar22,(long)(pIVar36->ItemFlagsStack).Size << 2);
      piVar22 = (pIVar36->ItemFlagsStack).Data;
      if ((piVar22 != (int *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar5 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar5 = *piVar5 + -1;
      }
      (*GImAllocatorFreeFunc)(piVar22,GImAllocatorUserData);
    }
    (pIVar36->ItemFlagsStack).Data = piVar47;
    (pIVar36->ItemFlagsStack).Capacity = 8;
  }
  (pIVar36->ItemFlagsStack).Data[(pIVar36->ItemFlagsStack).Size] = 0;
  (pIVar36->ItemFlagsStack).Size = (pIVar36->ItemFlagsStack).Size + 1;
  iVar53 = (pIVar36->GroupStack).Capacity;
  if (iVar53 < 0) {
    uVar48 = iVar53 / 2 + iVar53;
    uVar49 = 0;
    if (0 < (int)uVar48) {
      uVar49 = (ulong)uVar48;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar22 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar22 = *piVar22 + 1;
    }
    __dest_01 = (ImGuiGroupData *)(*GImAllocatorAllocFunc)(uVar49 * 0x30,GImAllocatorUserData);
    pIVar23 = (pIVar36->GroupStack).Data;
    if (pIVar23 != (ImGuiGroupData *)0x0) {
      memcpy(__dest_01,pIVar23,(long)(pIVar36->GroupStack).Size * 0x30);
      pIVar23 = (pIVar36->GroupStack).Data;
      if ((pIVar23 != (ImGuiGroupData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar22 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar22 = *piVar22 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar23,GImAllocatorUserData);
    }
    (pIVar36->GroupStack).Data = __dest_01;
    (pIVar36->GroupStack).Capacity = (int)uVar49;
  }
  (pIVar36->GroupStack).Size = 0;
  pIVar45 = GImGui;
  GImGui->DebugItemPickerBreakId = 0;
  if (pIVar45->DebugItemPickerActive == true) {
    uVar48 = pIVar45->HoveredIdPreviousFrame;
    pIVar45->MouseCursor = 7;
    bVar41 = IsKeyPressed(0x20e,true);
    if (bVar41) {
      pIVar45->DebugItemPickerActive = false;
    }
    pIVar37 = GImGui;
    if (uVar48 != 0 && (GImGui->IO).MouseDownDuration[0] == 0.0) {
      pIVar45->DebugItemPickerBreakId = uVar48;
      pIVar45->DebugItemPickerActive = false;
    }
    pIVar6 = &pIVar37->NextWindowData;
    *(byte *)&pIVar6->Flags = (byte)pIVar6->Flags | 0x40;
    (pIVar37->NextWindowData).BgAlphaVal = 0.6;
    BeginTooltipEx(0,0);
    Text("HoveredId: 0x%08X",(ulong)uVar48);
    Text("Press ESC to abort picking.");
    TextColored((GImGui->Style).Colors + (uVar48 == 0),"Click to break in debugger!");
    EndTooltip();
  }
  pIVar45 = GImGui;
  GImGui->DebugHookIdInfo = 0;
  if (pIVar45->FrameCount == (pIVar45->DebugStackTool).LastActiveFrame + 1) {
    IVar54 = pIVar45->HoveredIdPreviousFrame;
    if (IVar54 == 0) {
      IVar54 = pIVar45->ActiveId;
    }
    if ((pIVar45->DebugStackTool).QueryId != IVar54) {
      (pIVar45->DebugStackTool).QueryId = IVar54;
      (pIVar45->DebugStackTool).StackLevel = -1;
      iVar53 = (pIVar45->DebugStackTool).Results.Capacity;
      if (iVar53 < 0) {
        uVar48 = iVar53 / 2 + iVar53;
        uVar49 = 0;
        if (0 < (int)uVar48) {
          uVar49 = (ulong)uVar48;
        }
        if (pIVar45 != (ImGuiContext *)0x0) {
          piVar22 = &(pIVar45->IO).MetricsActiveAllocations;
          *piVar22 = *piVar22 + 1;
        }
        __dest_02 = (ImGuiStackLevelInfo *)
                    (*GImAllocatorAllocFunc)(uVar49 << 6,GImAllocatorUserData);
        pIVar24 = (pIVar45->DebugStackTool).Results.Data;
        if (pIVar24 != (ImGuiStackLevelInfo *)0x0) {
          memcpy(__dest_02,pIVar24,(long)(pIVar45->DebugStackTool).Results.Size << 6);
          pIVar24 = (pIVar45->DebugStackTool).Results.Data;
          if ((pIVar24 != (ImGuiStackLevelInfo *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar22 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar22 = *piVar22 + -1;
          }
          (*GImAllocatorFreeFunc)(pIVar24,GImAllocatorUserData);
        }
        (pIVar45->DebugStackTool).Results.Data = __dest_02;
        (pIVar45->DebugStackTool).Results.Capacity = (int)uVar49;
      }
      (pIVar45->DebugStackTool).Results.Size = 0;
    }
    if (IVar54 != 0) {
      iVar53 = (pIVar45->DebugStackTool).StackLevel;
      lVar61 = (long)iVar53;
      if ((-1 < lVar61) && (iVar53 < (pIVar45->DebugStackTool).Results.Size)) {
        pIVar24 = (pIVar45->DebugStackTool).Results.Data;
        if ((pIVar24[lVar61].QuerySuccess != false) || ('\x02' < pIVar24[lVar61].QueryFrameCount)) {
          (pIVar45->DebugStackTool).StackLevel = iVar53 + 1;
        }
      }
      uVar48 = (pIVar45->DebugStackTool).StackLevel;
      uVar49 = (ulong)uVar48;
      if (uVar49 == 0xffffffff) {
        pIVar45->DebugHookIdInfo = IVar54;
      }
      if ((-1 < (int)uVar48) && ((int)uVar48 < (pIVar45->DebugStackTool).Results.Size)) {
        pIVar24 = (pIVar45->DebugStackTool).Results.Data;
        pIVar45->DebugHookIdInfo = pIVar24[uVar49].ID;
        pIVar7 = &pIVar24[uVar49].QueryFrameCount;
        *pIVar7 = *pIVar7 + '\x01';
      }
    }
  }
  pIVar36->WithinFrameScopeWithImplicitWindow = true;
  pIVar45 = GImGui;
  (GImGui->NextWindowData).Flags = (GImGui->NextWindowData).Flags | 2;
  (pIVar45->NextWindowData).SizeVal.x = 400.0;
  (pIVar45->NextWindowData).SizeVal.y = 400.0;
  (pIVar45->NextWindowData).SizeCond = 4;
  Begin("Debug##Default",(bool *)0x0,0);
  if (pIVar36->CurrentWindow->IsFallbackWindow != false) {
    if (0 < (pIVar36->Hooks).Size) {
      lVar61 = 0;
      lVar63 = 0;
      do {
        pIVar14 = (pIVar36->Hooks).Data;
        if (*(int *)(pIVar14 + lVar61 + 4) == 1) {
          (**(code **)(pIVar14 + lVar61 + 0x10))(pIVar36,pIVar14 + lVar61);
        }
        lVar63 = lVar63 + 1;
        lVar61 = lVar61 + 0x20;
      } while (lVar63 < (pIVar36->Hooks).Size);
    }
    return;
  }
  __assert_fail("g.CurrentWindow->IsFallbackWindow == true",
                "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                ,0x114a,"void ImGui::NewFrame()");
}

Assistant:

void ImGui::NewFrame()
{
    IM_ASSERT(GImGui != NULL && "No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?");
    ImGuiContext& g = *GImGui;

    // Remove pending delete hooks before frame start.
    // This deferred removal avoid issues of removal while iterating the hook vector
    for (int n = g.Hooks.Size - 1; n >= 0; n--)
        if (g.Hooks[n].Type == ImGuiContextHookType_PendingRemoval_)
            g.Hooks.erase(&g.Hooks[n]);

    CallContextHooks(&g, ImGuiContextHookType_NewFramePre);

    // Check and assert for various common IO and Configuration mistakes
    ErrorCheckNewFrameSanityChecks();

    // Load settings on first frame, save settings when modified (after a delay)
    UpdateSettings();

    g.Time += g.IO.DeltaTime;
    g.WithinFrameScope = true;
    g.FrameCount += 1;
    g.TooltipOverrideCount = 0;
    g.WindowsActiveCount = 0;
    g.MenusIdSubmittedThisFrame.resize(0);

    // Calculate frame-rate for the user, as a purely luxurious feature
    g.FramerateSecPerFrameAccum += g.IO.DeltaTime - g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx];
    g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx] = g.IO.DeltaTime;
    g.FramerateSecPerFrameIdx = (g.FramerateSecPerFrameIdx + 1) % IM_ARRAYSIZE(g.FramerateSecPerFrame);
    g.FramerateSecPerFrameCount = ImMin(g.FramerateSecPerFrameCount + 1, IM_ARRAYSIZE(g.FramerateSecPerFrame));
    g.IO.Framerate = (g.FramerateSecPerFrameAccum > 0.0f) ? (1.0f / (g.FramerateSecPerFrameAccum / (float)g.FramerateSecPerFrameCount)) : FLT_MAX;

    UpdateViewportsNewFrame();

    // Setup current font and draw list shared data
    g.IO.Fonts->Locked = true;
    SetCurrentFont(GetDefaultFont());
    IM_ASSERT(g.Font->IsLoaded());
    ImRect virtual_space(FLT_MAX, FLT_MAX, -FLT_MAX, -FLT_MAX);
    for (int n = 0; n < g.Viewports.Size; n++)
        virtual_space.Add(g.Viewports[n]->GetMainRect());
    g.DrawListSharedData.ClipRectFullscreen = virtual_space.ToVec4();
    g.DrawListSharedData.CurveTessellationTol = g.Style.CurveTessellationTol;
    g.DrawListSharedData.SetCircleTessellationMaxError(g.Style.CircleTessellationMaxError);
    g.DrawListSharedData.InitialFlags = ImDrawListFlags_None;
    if (g.Style.AntiAliasedLines)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLines;
    if (g.Style.AntiAliasedLinesUseTex && !(g.Font->ContainerAtlas->Flags & ImFontAtlasFlags_NoBakedLines))
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLinesUseTex;
    if (g.Style.AntiAliasedFill)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedFill;
    if (g.IO.BackendFlags & ImGuiBackendFlags_RendererHasVtxOffset)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AllowVtxOffset;

    // Mark rendering data as invalid to prevent user who may have a handle on it to use it.
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawDataP.Clear();
    }

    // Drag and drop keep the source ID alive so even if the source disappear our state is consistent
    if (g.DragDropActive && g.DragDropPayload.SourceId == g.ActiveId)
        KeepAliveID(g.DragDropPayload.SourceId);

    // Update HoveredId data
    if (!g.HoveredIdPreviousFrame)
        g.HoveredIdTimer = 0.0f;
    if (!g.HoveredIdPreviousFrame || (g.HoveredId && g.ActiveId == g.HoveredId))
        g.HoveredIdNotActiveTimer = 0.0f;
    if (g.HoveredId)
        g.HoveredIdTimer += g.IO.DeltaTime;
    if (g.HoveredId && g.ActiveId != g.HoveredId)
        g.HoveredIdNotActiveTimer += g.IO.DeltaTime;
    g.HoveredIdPreviousFrame = g.HoveredId;
    g.HoveredIdPreviousFrameUsingMouseWheel = g.HoveredIdUsingMouseWheel;
    g.HoveredId = 0;
    g.HoveredIdAllowOverlap = false;
    g.HoveredIdUsingMouseWheel = false;
    g.HoveredIdDisabled = false;

    // Update ActiveId data (clear reference to active widget if the widget isn't alive anymore)
    if (g.ActiveIdIsAlive != g.ActiveId && g.ActiveIdPreviousFrame == g.ActiveId && g.ActiveId != 0)
        ClearActiveID();
    if (g.ActiveId)
        g.ActiveIdTimer += g.IO.DeltaTime;
    g.LastActiveIdTimer += g.IO.DeltaTime;
    g.ActiveIdPreviousFrame = g.ActiveId;
    g.ActiveIdPreviousFrameWindow = g.ActiveIdWindow;
    g.ActiveIdPreviousFrameHasBeenEditedBefore = g.ActiveIdHasBeenEditedBefore;
    g.ActiveIdIsAlive = 0;
    g.ActiveIdHasBeenEditedThisFrame = false;
    g.ActiveIdPreviousFrameIsAlive = false;
    g.ActiveIdIsJustActivated = false;
    if (g.TempInputId != 0 && g.ActiveId != g.TempInputId)
        g.TempInputId = 0;
    if (g.ActiveId == 0)
    {
        g.ActiveIdUsingNavDirMask = 0x00;
        g.ActiveIdUsingNavInputMask = 0x00;
        g.ActiveIdUsingKeyInputMask.ClearAllBits();
    }

    // Drag and drop
    g.DragDropAcceptIdPrev = g.DragDropAcceptIdCurr;
    g.DragDropAcceptIdCurr = 0;
    g.DragDropAcceptIdCurrRectSurface = FLT_MAX;
    g.DragDropWithinSource = false;
    g.DragDropWithinTarget = false;
    g.DragDropHoldJustPressedId = 0;

    // Close popups on focus lost (currently wip/opt-in)
    //if (g.IO.AppFocusLost)
    //    ClosePopupsExceptModals();

    // Process input queue (trickle as many events as possible)
    g.InputEventsTrail.resize(0);
    UpdateInputEvents(g.IO.ConfigInputTrickleEventQueue);

    // Update keyboard input state
    UpdateKeyboardInputs();

    //IM_ASSERT(g.IO.KeyCtrl == IsKeyDown(ImGuiKey_LeftCtrl) || IsKeyDown(ImGuiKey_RightCtrl));
    //IM_ASSERT(g.IO.KeyShift == IsKeyDown(ImGuiKey_LeftShift) || IsKeyDown(ImGuiKey_RightShift));
    //IM_ASSERT(g.IO.KeyAlt == IsKeyDown(ImGuiKey_LeftAlt) || IsKeyDown(ImGuiKey_RightAlt));
    //IM_ASSERT(g.IO.KeySuper == IsKeyDown(ImGuiKey_LeftSuper) || IsKeyDown(ImGuiKey_RightSuper));

    // Update gamepad/keyboard navigation
    NavUpdate();

    // Update mouse input state
    UpdateMouseInputs();

    // Find hovered window
    // (needs to be before UpdateMouseMovingWindowNewFrame so we fill g.HoveredWindowUnderMovingWindow on the mouse release frame)
    UpdateHoveredWindowAndCaptureFlags();

    // Handle user moving window with mouse (at the beginning of the frame to avoid input lag or sheering)
    UpdateMouseMovingWindowNewFrame();

    // Background darkening/whitening
    if (GetTopMostPopupModal() != NULL || (g.NavWindowingTarget != NULL && g.NavWindowingHighlightAlpha > 0.0f))
        g.DimBgRatio = ImMin(g.DimBgRatio + g.IO.DeltaTime * 6.0f, 1.0f);
    else
        g.DimBgRatio = ImMax(g.DimBgRatio - g.IO.DeltaTime * 10.0f, 0.0f);

    g.MouseCursor = ImGuiMouseCursor_Arrow;
    g.WantCaptureMouseNextFrame = g.WantCaptureKeyboardNextFrame = g.WantTextInputNextFrame = -1;

    // Platform IME data: reset for the frame
    g.PlatformImeDataPrev = g.PlatformImeData;
    g.PlatformImeData.WantVisible = false;

    // Mouse wheel scrolling, scale
    UpdateMouseWheel();

    // Mark all windows as not visible and compact unused memory.
    IM_ASSERT(g.WindowsFocusOrder.Size <= g.Windows.Size);
    const float memory_compact_start_time = (g.GcCompactAll || g.IO.ConfigMemoryCompactTimer < 0.0f) ? FLT_MAX : (float)g.Time - g.IO.ConfigMemoryCompactTimer;
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        window->WasActive = window->Active;
        window->BeginCount = 0;
        window->Active = false;
        window->WriteAccessed = false;

        // Garbage collect transient buffers of recently unused windows
        if (!window->WasActive && !window->MemoryCompacted && window->LastTimeActive < memory_compact_start_time)
            GcCompactTransientWindowBuffers(window);
    }

    // Garbage collect transient buffers of recently unused tables
    for (int i = 0; i < g.TablesLastTimeActive.Size; i++)
        if (g.TablesLastTimeActive[i] >= 0.0f && g.TablesLastTimeActive[i] < memory_compact_start_time)
            TableGcCompactTransientBuffers(g.Tables.GetByIndex(i));
    for (int i = 0; i < g.TablesTempData.Size; i++)
        if (g.TablesTempData[i].LastTimeActive >= 0.0f && g.TablesTempData[i].LastTimeActive < memory_compact_start_time)
            TableGcCompactTransientBuffers(&g.TablesTempData[i]);
    if (g.GcCompactAll)
        GcCompactTransientMiscBuffers();
    g.GcCompactAll = false;

    // Closing the focused window restore focus to the first active root window in descending z-order
    if (g.NavWindow && !g.NavWindow->WasActive)
        FocusTopMostWindowUnderOne(NULL, NULL);

    // No window should be open at the beginning of the frame.
    // But in order to allow the user to call NewFrame() multiple times without calling Render(), we are doing an explicit clear.
    g.CurrentWindowStack.resize(0);
    g.BeginPopupStack.resize(0);
    g.ItemFlagsStack.resize(0);
    g.ItemFlagsStack.push_back(ImGuiItemFlags_None);
    g.GroupStack.resize(0);

    // [DEBUG] Update debug features
    UpdateDebugToolItemPicker();
    UpdateDebugToolStackQueries();

    // Create implicit/fallback window - which we will only render it if the user has added something to it.
    // We don't use "Debug" to avoid colliding with user trying to create a "Debug" window with custom flags.
    // This fallback is particularly important as it avoid ImGui:: calls from crashing.
    g.WithinFrameScopeWithImplicitWindow = true;
    SetNextWindowSize(ImVec2(400, 400), ImGuiCond_FirstUseEver);
    Begin("Debug##Default");
    IM_ASSERT(g.CurrentWindow->IsFallbackWindow == true);

    CallContextHooks(&g, ImGuiContextHookType_NewFramePost);
}